

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx512::CurveNiIntersector1<8>::
     occluded_t<embree::avx512::SweepCurve1Intersector1<embree::BezierCurveT>,embree::avx512::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  undefined1 auVar3 [16];
  Primitive PVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  undefined8 uVar15;
  ulong uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  int iVar19;
  long lVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  byte bVar61;
  byte bVar62;
  byte bVar63;
  byte bVar64;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  ulong uVar65;
  ulong uVar66;
  bool bVar67;
  undefined1 uVar68;
  bool bVar69;
  undefined1 uVar70;
  ulong uVar71;
  uint uVar72;
  uint uVar121;
  uint uVar122;
  uint uVar124;
  uint uVar125;
  uint uVar126;
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  uint uVar123;
  uint uVar127;
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  float pp;
  float fVar128;
  undefined4 uVar129;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  float fVar141;
  undefined1 auVar135 [32];
  undefined1 auVar130 [16];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  float fVar142;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  float fVar185;
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [64];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [64];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [16];
  undefined1 auVar224 [64];
  undefined1 auVar225 [28];
  undefined1 auVar226 [64];
  undefined1 auVar227 [32];
  undefined1 auVar228 [64];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [64];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [64];
  undefined1 auVar235 [64];
  undefined1 auVar236 [64];
  undefined1 auVar237 [64];
  undefined1 auVar238 [64];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  undefined1 auVar244 [64];
  undefined1 in_ZMM31 [64];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloatx_conflict vu0;
  vfloat<8> dOdO;
  StackEntry stack [3];
  int local_978;
  int local_964;
  undefined1 local_960 [8];
  float fStack_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float fStack_948;
  float fStack_944;
  ulong local_928;
  undefined1 local_920 [32];
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  undefined1 auStack_8f0 [16];
  undefined1 local_8d0 [16];
  undefined1 local_8c0 [16];
  undefined4 local_8a8;
  uint local_8a4;
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  undefined1 auStack_710 [16];
  RTCFilterFunctionNArguments local_6f0;
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined8 local_5e0;
  undefined4 local_5d8;
  float local_5d4;
  undefined4 local_5d0;
  undefined4 local_5cc;
  undefined4 local_5c8;
  uint local_5c4;
  uint local_5c0;
  ulong local_5a8;
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [16];
  undefined1 local_530 [16];
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  undefined1 local_510 [16];
  undefined1 local_500 [16];
  Primitive *local_4f0;
  ulong local_4e8;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_330 [16];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  float local_200;
  float fStack_1fc;
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  uint auStack_160 [8];
  ulong uStack_140;
  int aiStack_138 [66];
  undefined1 auVar110 [32];
  
  PVar4 = prim[1];
  uVar71 = (ulong)(byte)PVar4;
  fVar142 = *(float *)(prim + uVar71 * 0x19 + 0x12);
  auVar14 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + uVar71 * 0x19 + 6));
  fVar185 = fVar142 * auVar14._0_4_;
  fVar128 = fVar142 * (ray->dir).field_0.m128[0];
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar71 * 4 + 6);
  auVar86 = vpmovsxbd_avx2(auVar75);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar71 * 5 + 6);
  auVar84 = vpmovsxbd_avx2(auVar76);
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar71 * 6 + 6);
  auVar87 = vpmovsxbd_avx2(auVar77);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + uVar71 * 0xb + 6);
  auVar88 = vpmovsxbd_avx2(auVar78);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar4 * 0xc) + 6);
  auVar93 = vpmovsxbd_avx2(auVar73);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar89 = vcvtdq2ps_avx(auVar93);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + (uint)(byte)PVar4 * 0xc + uVar71 + 6);
  auVar85 = vpmovsxbd_avx2(auVar79);
  auVar85 = vcvtdq2ps_avx(auVar85);
  uVar65 = (ulong)(uint)((int)(uVar71 * 9) * 2);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + uVar65 + 6);
  auVar90 = vpmovsxbd_avx2(auVar74);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + uVar65 + uVar71 + 6);
  auVar91 = vpmovsxbd_avx2(auVar80);
  auVar91 = vcvtdq2ps_avx(auVar91);
  uVar66 = (ulong)(uint)((int)(uVar71 * 5) << 2);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + uVar66 + 6);
  auVar83 = vpmovsxbd_avx2(auVar3);
  auVar92 = vcvtdq2ps_avx(auVar83);
  auVar103._4_4_ = fVar128;
  auVar103._0_4_ = fVar128;
  auVar103._8_4_ = fVar128;
  auVar103._12_4_ = fVar128;
  auVar103._16_4_ = fVar128;
  auVar103._20_4_ = fVar128;
  auVar103._24_4_ = fVar128;
  auVar103._28_4_ = fVar128;
  auVar105._8_4_ = 1;
  auVar105._0_8_ = 0x100000001;
  auVar105._12_4_ = 1;
  auVar105._16_4_ = 1;
  auVar105._20_4_ = 1;
  auVar105._24_4_ = 1;
  auVar105._28_4_ = 1;
  auVar81 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar95 = ZEXT1632(CONCAT412(fVar142 * (ray->dir).field_0.m128[3],
                               CONCAT48(fVar142 * (ray->dir).field_0.m128[2],
                                        CONCAT44(fVar142 * (ray->dir).field_0.m128[1],fVar128))));
  auVar94 = vpermps_avx2(auVar105,auVar95);
  auVar82 = vpermps_avx512vl(auVar81,auVar95);
  fVar128 = auVar82._0_4_;
  fVar153 = auVar82._4_4_;
  auVar95._4_4_ = fVar153 * auVar87._4_4_;
  auVar95._0_4_ = fVar128 * auVar87._0_4_;
  fVar155 = auVar82._8_4_;
  auVar95._8_4_ = fVar155 * auVar87._8_4_;
  fVar141 = auVar82._12_4_;
  auVar95._12_4_ = fVar141 * auVar87._12_4_;
  fVar157 = auVar82._16_4_;
  auVar95._16_4_ = fVar157 * auVar87._16_4_;
  fVar159 = auVar82._20_4_;
  auVar95._20_4_ = fVar159 * auVar87._20_4_;
  fVar161 = auVar82._24_4_;
  auVar95._24_4_ = fVar161 * auVar87._24_4_;
  auVar95._28_4_ = auVar93._28_4_;
  auVar93._4_4_ = auVar85._4_4_ * fVar153;
  auVar93._0_4_ = auVar85._0_4_ * fVar128;
  auVar93._8_4_ = auVar85._8_4_ * fVar155;
  auVar93._12_4_ = auVar85._12_4_ * fVar141;
  auVar93._16_4_ = auVar85._16_4_ * fVar157;
  auVar93._20_4_ = auVar85._20_4_ * fVar159;
  auVar93._24_4_ = auVar85._24_4_ * fVar161;
  auVar93._28_4_ = auVar83._28_4_;
  auVar83._4_4_ = auVar92._4_4_ * fVar153;
  auVar83._0_4_ = auVar92._0_4_ * fVar128;
  auVar83._8_4_ = auVar92._8_4_ * fVar155;
  auVar83._12_4_ = auVar92._12_4_ * fVar141;
  auVar83._16_4_ = auVar92._16_4_ * fVar157;
  auVar83._20_4_ = auVar92._20_4_ * fVar159;
  auVar83._24_4_ = auVar92._24_4_ * fVar161;
  auVar83._28_4_ = auVar82._28_4_;
  auVar75 = vfmadd231ps_fma(auVar95,auVar94,auVar84);
  auVar76 = vfmadd231ps_fma(auVar93,auVar94,auVar89);
  auVar77 = vfmadd231ps_fma(auVar83,auVar91,auVar94);
  auVar75 = vfmadd231ps_fma(ZEXT1632(auVar75),auVar103,auVar86);
  auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),auVar103,auVar88);
  auVar77 = vfmadd231ps_fma(ZEXT1632(auVar77),auVar90,auVar103);
  auVar104._4_4_ = fVar185;
  auVar104._0_4_ = fVar185;
  auVar104._8_4_ = fVar185;
  auVar104._12_4_ = fVar185;
  auVar104._16_4_ = fVar185;
  auVar104._20_4_ = fVar185;
  auVar104._24_4_ = fVar185;
  auVar104._28_4_ = fVar185;
  auVar83 = ZEXT1632(CONCAT412(fVar142 * auVar14._12_4_,
                               CONCAT48(fVar142 * auVar14._8_4_,
                                        CONCAT44(fVar142 * auVar14._4_4_,fVar185))));
  auVar93 = vpermps_avx2(auVar105,auVar83);
  auVar83 = vpermps_avx512vl(auVar81,auVar83);
  fVar142 = auVar83._0_4_;
  fVar128 = auVar83._4_4_;
  auVar94._4_4_ = fVar128 * auVar87._4_4_;
  auVar94._0_4_ = fVar142 * auVar87._0_4_;
  fVar153 = auVar83._8_4_;
  auVar94._8_4_ = fVar153 * auVar87._8_4_;
  fVar155 = auVar83._12_4_;
  auVar94._12_4_ = fVar155 * auVar87._12_4_;
  fVar141 = auVar83._16_4_;
  auVar94._16_4_ = fVar141 * auVar87._16_4_;
  fVar157 = auVar83._20_4_;
  auVar94._20_4_ = fVar157 * auVar87._20_4_;
  fVar159 = auVar83._24_4_;
  auVar94._24_4_ = fVar159 * auVar87._24_4_;
  auVar94._28_4_ = 1;
  auVar81._4_4_ = auVar85._4_4_ * fVar128;
  auVar81._0_4_ = auVar85._0_4_ * fVar142;
  auVar81._8_4_ = auVar85._8_4_ * fVar153;
  auVar81._12_4_ = auVar85._12_4_ * fVar155;
  auVar81._16_4_ = auVar85._16_4_ * fVar141;
  auVar81._20_4_ = auVar85._20_4_ * fVar157;
  auVar81._24_4_ = auVar85._24_4_ * fVar159;
  auVar81._28_4_ = auVar87._28_4_;
  auVar85._4_4_ = auVar92._4_4_ * fVar128;
  auVar85._0_4_ = auVar92._0_4_ * fVar142;
  auVar85._8_4_ = auVar92._8_4_ * fVar153;
  auVar85._12_4_ = auVar92._12_4_ * fVar155;
  auVar85._16_4_ = auVar92._16_4_ * fVar141;
  auVar85._20_4_ = auVar92._20_4_ * fVar157;
  auVar85._24_4_ = auVar92._24_4_ * fVar159;
  auVar85._28_4_ = auVar83._28_4_;
  auVar78 = vfmadd231ps_fma(auVar94,auVar93,auVar84);
  auVar73 = vfmadd231ps_fma(auVar81,auVar93,auVar89);
  auVar79 = vfmadd231ps_fma(auVar85,auVar93,auVar91);
  auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar104,auVar86);
  auVar73 = vfmadd231ps_fma(ZEXT1632(auVar73),auVar104,auVar88);
  auVar101._8_4_ = 0x7fffffff;
  auVar101._0_8_ = 0x7fffffff7fffffff;
  auVar101._12_4_ = 0x7fffffff;
  auVar101._16_4_ = 0x7fffffff;
  auVar101._20_4_ = 0x7fffffff;
  auVar101._24_4_ = 0x7fffffff;
  auVar101._28_4_ = 0x7fffffff;
  auVar79 = vfmadd231ps_fma(ZEXT1632(auVar79),auVar104,auVar90);
  auVar86 = vandps_avx(ZEXT1632(auVar75),auVar101);
  auVar203._8_4_ = 0x219392ef;
  auVar203._0_8_ = 0x219392ef219392ef;
  auVar203._12_4_ = 0x219392ef;
  auVar203._16_4_ = 0x219392ef;
  auVar203._20_4_ = 0x219392ef;
  auVar203._24_4_ = 0x219392ef;
  auVar203._28_4_ = 0x219392ef;
  uVar65 = vcmpps_avx512vl(auVar86,auVar203,1);
  bVar67 = (bool)((byte)uVar65 & 1);
  auVar82._0_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar75._0_4_;
  bVar67 = (bool)((byte)(uVar65 >> 1) & 1);
  auVar82._4_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar75._4_4_;
  bVar67 = (bool)((byte)(uVar65 >> 2) & 1);
  auVar82._8_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar75._8_4_;
  bVar67 = (bool)((byte)(uVar65 >> 3) & 1);
  auVar82._12_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar75._12_4_;
  auVar82._16_4_ = (uint)((byte)(uVar65 >> 4) & 1) * 0x219392ef;
  auVar82._20_4_ = (uint)((byte)(uVar65 >> 5) & 1) * 0x219392ef;
  auVar82._24_4_ = (uint)((byte)(uVar65 >> 6) & 1) * 0x219392ef;
  auVar82._28_4_ = (uint)(byte)(uVar65 >> 7) * 0x219392ef;
  auVar86 = vandps_avx(ZEXT1632(auVar76),auVar101);
  uVar65 = vcmpps_avx512vl(auVar86,auVar203,1);
  bVar67 = (bool)((byte)uVar65 & 1);
  auVar96._0_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar76._0_4_;
  bVar67 = (bool)((byte)(uVar65 >> 1) & 1);
  auVar96._4_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar76._4_4_;
  bVar67 = (bool)((byte)(uVar65 >> 2) & 1);
  auVar96._8_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar76._8_4_;
  bVar67 = (bool)((byte)(uVar65 >> 3) & 1);
  auVar96._12_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar76._12_4_;
  auVar96._16_4_ = (uint)((byte)(uVar65 >> 4) & 1) * 0x219392ef;
  auVar96._20_4_ = (uint)((byte)(uVar65 >> 5) & 1) * 0x219392ef;
  auVar96._24_4_ = (uint)((byte)(uVar65 >> 6) & 1) * 0x219392ef;
  auVar96._28_4_ = (uint)(byte)(uVar65 >> 7) * 0x219392ef;
  auVar86 = vandps_avx(ZEXT1632(auVar77),auVar101);
  uVar65 = vcmpps_avx512vl(auVar86,auVar203,1);
  bVar67 = (bool)((byte)uVar65 & 1);
  auVar86._0_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar77._0_4_;
  bVar67 = (bool)((byte)(uVar65 >> 1) & 1);
  auVar86._4_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar77._4_4_;
  bVar67 = (bool)((byte)(uVar65 >> 2) & 1);
  auVar86._8_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar77._8_4_;
  bVar67 = (bool)((byte)(uVar65 >> 3) & 1);
  auVar86._12_4_ = (uint)bVar67 * 0x219392ef | (uint)!bVar67 * auVar77._12_4_;
  auVar86._16_4_ = (uint)((byte)(uVar65 >> 4) & 1) * 0x219392ef;
  auVar86._20_4_ = (uint)((byte)(uVar65 >> 5) & 1) * 0x219392ef;
  auVar86._24_4_ = (uint)((byte)(uVar65 >> 6) & 1) * 0x219392ef;
  auVar86._28_4_ = (uint)(byte)(uVar65 >> 7) * 0x219392ef;
  auVar84 = vrcp14ps_avx512vl(auVar82);
  auVar102._8_4_ = 0x3f800000;
  auVar102._0_8_ = 0x3f8000003f800000;
  auVar102._12_4_ = 0x3f800000;
  auVar102._16_4_ = 0x3f800000;
  auVar102._20_4_ = 0x3f800000;
  auVar102._24_4_ = 0x3f800000;
  auVar102._28_4_ = 0x3f800000;
  auVar75 = vfnmadd213ps_fma(auVar82,auVar84,auVar102);
  auVar75 = vfmadd132ps_fma(ZEXT1632(auVar75),auVar84,auVar84);
  auVar84 = vrcp14ps_avx512vl(auVar96);
  auVar76 = vfnmadd213ps_fma(auVar96,auVar84,auVar102);
  auVar76 = vfmadd132ps_fma(ZEXT1632(auVar76),auVar84,auVar84);
  auVar84 = vrcp14ps_avx512vl(auVar86);
  auVar77 = vfnmadd213ps_fma(auVar86,auVar84,auVar102);
  auVar77 = vfmadd132ps_fma(ZEXT1632(auVar77),auVar84,auVar84);
  auVar86 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar71 * 7 + 6));
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar86 = vsubps_avx(auVar86,ZEXT1632(auVar78));
  auVar90._4_4_ = auVar75._4_4_ * auVar86._4_4_;
  auVar90._0_4_ = auVar75._0_4_ * auVar86._0_4_;
  auVar90._8_4_ = auVar75._8_4_ * auVar86._8_4_;
  auVar90._12_4_ = auVar75._12_4_ * auVar86._12_4_;
  auVar90._16_4_ = auVar86._16_4_ * 0.0;
  auVar90._20_4_ = auVar86._20_4_ * 0.0;
  auVar90._24_4_ = auVar86._24_4_ * 0.0;
  auVar90._28_4_ = auVar86._28_4_;
  auVar86 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar71 * 9 + 6));
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar86 = vsubps_avx(auVar86,ZEXT1632(auVar78));
  auVar85 = vpbroadcastd_avx512vl();
  auVar84 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar4 * 0x10 + 6));
  auVar100._0_4_ = auVar75._0_4_ * auVar86._0_4_;
  auVar100._4_4_ = auVar75._4_4_ * auVar86._4_4_;
  auVar100._8_4_ = auVar75._8_4_ * auVar86._8_4_;
  auVar100._12_4_ = auVar75._12_4_ * auVar86._12_4_;
  auVar100._16_4_ = auVar86._16_4_ * 0.0;
  auVar100._20_4_ = auVar86._20_4_ * 0.0;
  auVar100._24_4_ = auVar86._24_4_ * 0.0;
  auVar100._28_4_ = 0;
  auVar86 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar4 * 0x10 + uVar71 * -2 + 6));
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar86 = vsubps_avx(auVar86,ZEXT1632(auVar73));
  auVar91._4_4_ = auVar76._4_4_ * auVar86._4_4_;
  auVar91._0_4_ = auVar76._0_4_ * auVar86._0_4_;
  auVar91._8_4_ = auVar76._8_4_ * auVar86._8_4_;
  auVar91._12_4_ = auVar76._12_4_ * auVar86._12_4_;
  auVar91._16_4_ = auVar86._16_4_ * 0.0;
  auVar91._20_4_ = auVar86._20_4_ * 0.0;
  auVar91._24_4_ = auVar86._24_4_ * 0.0;
  auVar91._28_4_ = auVar86._28_4_;
  auVar86 = vcvtdq2ps_avx(auVar84);
  auVar86 = vsubps_avx(auVar86,ZEXT1632(auVar73));
  auVar99._0_4_ = auVar76._0_4_ * auVar86._0_4_;
  auVar99._4_4_ = auVar76._4_4_ * auVar86._4_4_;
  auVar99._8_4_ = auVar76._8_4_ * auVar86._8_4_;
  auVar99._12_4_ = auVar76._12_4_ * auVar86._12_4_;
  auVar99._16_4_ = auVar86._16_4_ * 0.0;
  auVar99._20_4_ = auVar86._20_4_ * 0.0;
  auVar99._24_4_ = auVar86._24_4_ * 0.0;
  auVar99._28_4_ = 0;
  auVar86 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar66 + uVar71 + 6));
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar86 = vsubps_avx(auVar86,ZEXT1632(auVar79));
  auVar92._4_4_ = auVar86._4_4_ * auVar77._4_4_;
  auVar92._0_4_ = auVar86._0_4_ * auVar77._0_4_;
  auVar92._8_4_ = auVar86._8_4_ * auVar77._8_4_;
  auVar92._12_4_ = auVar86._12_4_ * auVar77._12_4_;
  auVar92._16_4_ = auVar86._16_4_ * 0.0;
  auVar92._20_4_ = auVar86._20_4_ * 0.0;
  auVar92._24_4_ = auVar86._24_4_ * 0.0;
  auVar92._28_4_ = auVar86._28_4_;
  auVar86 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar71 * 0x17 + 6));
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar86 = vsubps_avx(auVar86,ZEXT1632(auVar79));
  auVar98._0_4_ = auVar77._0_4_ * auVar86._0_4_;
  auVar98._4_4_ = auVar77._4_4_ * auVar86._4_4_;
  auVar98._8_4_ = auVar77._8_4_ * auVar86._8_4_;
  auVar98._12_4_ = auVar77._12_4_ * auVar86._12_4_;
  auVar98._16_4_ = auVar86._16_4_ * 0.0;
  auVar98._20_4_ = auVar86._20_4_ * 0.0;
  auVar98._24_4_ = auVar86._24_4_ * 0.0;
  auVar98._28_4_ = 0;
  auVar86 = vpminsd_avx2(auVar90,auVar100);
  auVar84 = vpminsd_avx2(auVar91,auVar99);
  auVar86 = vmaxps_avx(auVar86,auVar84);
  auVar84 = vpminsd_avx2(auVar92,auVar98);
  uVar129 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar87._4_4_ = uVar129;
  auVar87._0_4_ = uVar129;
  auVar87._8_4_ = uVar129;
  auVar87._12_4_ = uVar129;
  auVar87._16_4_ = uVar129;
  auVar87._20_4_ = uVar129;
  auVar87._24_4_ = uVar129;
  auVar87._28_4_ = uVar129;
  auVar84 = vmaxps_avx512vl(auVar84,auVar87);
  auVar86 = vmaxps_avx(auVar86,auVar84);
  auVar84._8_4_ = 0x3f7ffffa;
  auVar84._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar84._12_4_ = 0x3f7ffffa;
  auVar84._16_4_ = 0x3f7ffffa;
  auVar84._20_4_ = 0x3f7ffffa;
  auVar84._24_4_ = 0x3f7ffffa;
  auVar84._28_4_ = 0x3f7ffffa;
  local_240 = vmulps_avx512vl(auVar86,auVar84);
  auVar86 = vpmaxsd_avx2(auVar90,auVar100);
  auVar84 = vpmaxsd_avx2(auVar91,auVar99);
  auVar86 = vminps_avx(auVar86,auVar84);
  auVar84 = vpmaxsd_avx2(auVar92,auVar98);
  fVar142 = ray->tfar;
  auVar88._4_4_ = fVar142;
  auVar88._0_4_ = fVar142;
  auVar88._8_4_ = fVar142;
  auVar88._12_4_ = fVar142;
  auVar88._16_4_ = fVar142;
  auVar88._20_4_ = fVar142;
  auVar88._24_4_ = fVar142;
  auVar88._28_4_ = fVar142;
  auVar84 = vminps_avx512vl(auVar84,auVar88);
  auVar86 = vminps_avx(auVar86,auVar84);
  auVar89._8_4_ = 0x3f800003;
  auVar89._0_8_ = 0x3f8000033f800003;
  auVar89._12_4_ = 0x3f800003;
  auVar89._16_4_ = 0x3f800003;
  auVar89._20_4_ = 0x3f800003;
  auVar89._24_4_ = 0x3f800003;
  auVar89._28_4_ = 0x3f800003;
  auVar86 = vmulps_avx512vl(auVar86,auVar89);
  uVar17 = vpcmpgtd_avx512vl(auVar85,_DAT_01fe9900);
  uVar15 = vcmpps_avx512vl(local_240,auVar86,2);
  if ((byte)((byte)uVar15 & (byte)uVar17) == 0) {
    return false;
  }
  local_4e8 = (ulong)(byte)((byte)uVar15 & (byte)uVar17);
  local_4f0 = prim;
LAB_01d428d9:
  lVar20 = 0;
  for (uVar65 = local_4e8; (uVar65 & 1) == 0; uVar65 = uVar65 >> 1 | 0x8000000000000000) {
    lVar20 = lVar20 + 1;
  }
  local_928 = (ulong)*(uint *)(prim + 2);
  pGVar5 = (context->scene->geometries).items[*(uint *)(prim + 2)].ptr;
  local_5a8 = (ulong)*(uint *)(prim + lVar20 * 4 + 6);
  uVar65 = (ulong)*(uint *)(*(long *)&pGVar5->field_0x58 +
                           pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar20 * 4 + 6));
  p_Var6 = pGVar5[1].intersectionFilterN;
  lVar20 = *(long *)&pGVar5[1].time_range.upper;
  auVar75 = *(undefined1 (*) [16])(lVar20 + (long)p_Var6 * uVar65);
  auVar76 = *(undefined1 (*) [16])(lVar20 + (uVar65 + 1) * (long)p_Var6);
  auVar77 = *(undefined1 (*) [16])(lVar20 + (uVar65 + 2) * (long)p_Var6);
  local_4e8 = local_4e8 - 1 & local_4e8;
  auVar78 = *(undefined1 (*) [16])(lVar20 + (uVar65 + 3) * (long)p_Var6);
  if (local_4e8 != 0) {
    uVar66 = local_4e8 - 1 & local_4e8;
    for (uVar65 = local_4e8; (uVar65 & 1) == 0; uVar65 = uVar65 >> 1 | 0x8000000000000000) {
    }
    if (uVar66 != 0) {
      for (; (uVar66 & 1) == 0; uVar66 = uVar66 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar205._0_4_ = auVar75._0_4_ + auVar76._0_4_ + auVar77._0_4_ + auVar78._0_4_;
  auVar205._4_4_ = auVar75._4_4_ + auVar76._4_4_ + auVar77._4_4_ + auVar78._4_4_;
  auVar205._8_4_ = auVar75._8_4_ + auVar76._8_4_ + auVar77._8_4_ + auVar78._8_4_;
  auVar205._12_4_ = auVar75._12_4_ + auVar76._12_4_ + auVar77._12_4_ + auVar78._12_4_;
  aVar1 = (ray->org).field_0;
  aVar2 = (ray->dir).field_0.field_1;
  auVar14._8_4_ = 0x3e800000;
  auVar14._0_8_ = 0x3e8000003e800000;
  auVar14._12_4_ = 0x3e800000;
  auVar73 = vmulps_avx512vl(auVar205,auVar14);
  auVar73 = vsubps_avx(auVar73,(undefined1  [16])aVar1);
  auVar73 = vdpps_avx(auVar73,(undefined1  [16])aVar2,0x7f);
  auVar79 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
  auVar223._4_12_ = ZEXT812(0) << 0x20;
  auVar223._0_4_ = auVar79._0_4_;
  auVar74 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar223);
  auVar79 = vfnmadd213ss_fma(auVar74,auVar79,ZEXT416(0x40000000));
  fVar142 = auVar73._0_4_ * auVar74._0_4_ * auVar79._0_4_;
  local_540 = ZEXT416((uint)fVar142);
  auVar206._4_4_ = fVar142;
  auVar206._0_4_ = fVar142;
  auVar206._8_4_ = fVar142;
  auVar206._12_4_ = fVar142;
  fStack_950 = fVar142;
  _local_960 = auVar206;
  fStack_94c = fVar142;
  fStack_948 = fVar142;
  fStack_944 = fVar142;
  auVar73 = vfmadd231ps_fma((undefined1  [16])aVar1,(undefined1  [16])aVar2,auVar206);
  auVar73 = vblendps_avx(auVar73,ZEXT816(0) << 0x40,8);
  auVar75 = vsubps_avx(auVar75,auVar73);
  auVar77 = vsubps_avx(auVar77,auVar73);
  local_620 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->dir).field_0.m128[0]));
  uVar129 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
  local_380._4_4_ = uVar129;
  local_380._0_4_ = uVar129;
  local_380._8_4_ = uVar129;
  local_380._12_4_ = uVar129;
  local_380._16_4_ = uVar129;
  local_380._20_4_ = uVar129;
  local_380._24_4_ = uVar129;
  local_380._28_4_ = uVar129;
  local_7a0 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->dir).field_0.m128[2]));
  auVar76 = vsubps_avx(auVar76,auVar73);
  auVar78 = vsubps_avx(auVar78,auVar73);
  uVar129 = auVar75._0_4_;
  local_740._4_4_ = uVar129;
  local_740._0_4_ = uVar129;
  local_740._8_4_ = uVar129;
  local_740._12_4_ = uVar129;
  local_740._16_4_ = uVar129;
  local_740._20_4_ = uVar129;
  local_740._24_4_ = uVar129;
  local_740._28_4_ = uVar129;
  auVar224 = ZEXT3264(local_740);
  auVar109._8_4_ = 1;
  auVar109._0_8_ = 0x100000001;
  auVar109._12_4_ = 1;
  auVar109._16_4_ = 1;
  auVar109._20_4_ = 1;
  auVar109._24_4_ = 1;
  auVar109._28_4_ = 1;
  local_480 = ZEXT1632(auVar75);
  local_760 = vpermps_avx2(auVar109,local_480);
  auVar226 = ZEXT3264(local_760);
  auVar110._8_4_ = 2;
  auVar110._0_8_ = 0x200000002;
  auVar110._12_4_ = 2;
  auVar110._16_4_ = 2;
  auVar110._20_4_ = 2;
  auVar110._24_4_ = 2;
  auVar110._28_4_ = 2;
  local_780 = vpermps_avx2(auVar110,local_480);
  auVar228 = ZEXT3264(local_780);
  auVar179._8_4_ = 3;
  auVar179._0_8_ = 0x300000003;
  auVar179._12_4_ = 3;
  auVar179._16_4_ = 3;
  auVar179._20_4_ = 3;
  auVar179._24_4_ = 3;
  auVar179._28_4_ = 3;
  local_920 = vpermps_avx2(auVar179,local_480);
  auVar231 = ZEXT3264(local_920);
  local_7c0 = vbroadcastss_avx512vl(auVar76);
  auVar244 = ZEXT3264(local_7c0);
  local_4c0 = ZEXT1632(auVar76);
  local_7e0 = vpermps_avx512vl(auVar109,local_4c0);
  auVar242 = ZEXT3264(local_7e0);
  local_800 = vpermps_avx2(auVar110,local_4c0);
  auVar234 = ZEXT3264(local_800);
  local_820 = vpermps_avx2(auVar179,local_4c0);
  auVar235 = ZEXT3264(local_820);
  local_840 = vbroadcastss_avx512vl(auVar77);
  auVar236 = ZEXT3264(local_840);
  local_4a0 = ZEXT1632(auVar77);
  local_660 = vpermps_avx512vl(auVar109,local_4a0);
  auVar237 = ZEXT3264(local_660);
  local_680 = vpermps_avx512vl(auVar110,local_4a0);
  auVar238 = ZEXT3264(local_680);
  local_860 = vpermps_avx512vl(auVar179,local_4a0);
  auVar239 = ZEXT3264(local_860);
  local_200 = auVar78._0_4_;
  _local_4e0 = ZEXT1632(auVar78);
  local_880 = vpermps_avx512vl(auVar109,_local_4e0);
  auVar240 = ZEXT3264(local_880);
  local_6a0 = vpermps_avx512vl(auVar110,_local_4e0);
  auVar241 = ZEXT3264(local_6a0);
  local_8a0 = vpermps_avx512vl(auVar179,_local_4e0);
  auVar243 = ZEXT3264(local_8a0);
  auVar86 = vpermps_avx512vl(auVar110,ZEXT1632(CONCAT412(aVar2.field_3.w * aVar2.field_3.w,
                                                         CONCAT48(aVar2.z * aVar2.z,
                                                                  CONCAT44(aVar2.y * aVar2.y,
                                                                           aVar2.x * aVar2.x)))));
  auVar86 = vfmadd231ps_avx512vl(auVar86,local_380,local_380);
  local_1e0 = vfmadd231ps_avx512vl(auVar86,local_620,local_620);
  auVar108._8_4_ = 0x7fffffff;
  auVar108._0_8_ = 0x7fffffff7fffffff;
  auVar108._12_4_ = 0x7fffffff;
  auVar108._16_4_ = 0x7fffffff;
  auVar108._20_4_ = 0x7fffffff;
  auVar108._24_4_ = 0x7fffffff;
  auVar108._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_1e0,auVar108);
  local_978 = 1;
  uVar65 = 0;
  bVar67 = false;
  local_330 = ZEXT816(0x3f80000000000000);
  auVar218 = ZEXT3264(CONCAT428(0x3f800000,
                                CONCAT424(0x3f800000,
                                          CONCAT420(0x3f800000,
                                                    CONCAT416(0x3f800000,
                                                              CONCAT412(0x3f800000,
                                                                        CONCAT48(0x3f800000,
                                                                                 0x3f8000003f800000)
                                                                       ))))));
  fStack_1fc = local_200;
  fStack_1f8 = local_200;
  fStack_1f4 = local_200;
  fStack_1f0 = local_200;
  fStack_1ec = local_200;
  fStack_1e8 = local_200;
  fStack_1e4 = local_200;
  local_220 = local_1e0;
  do {
    auVar75 = vmovshdup_avx(local_330);
    auVar75 = vsubps_avx(auVar75,local_330);
    fVar157 = auVar75._0_4_;
    fVar141 = fVar157 * 0.04761905;
    local_900._0_4_ = local_330._0_4_;
    local_900._4_4_ = local_900._0_4_;
    fStack_8f8 = (float)local_900._0_4_;
    fStack_8f4 = (float)local_900._0_4_;
    register0x000012d0 = local_900._0_4_;
    register0x000012d4 = local_900._0_4_;
    register0x000012d8 = local_900._0_4_;
    register0x000012dc = local_900._0_4_;
    auVar198._4_4_ = fVar157;
    auVar198._0_4_ = fVar157;
    auVar198._8_4_ = fVar157;
    auVar198._12_4_ = fVar157;
    register0x00001310 = fVar157;
    _local_720 = auVar198;
    register0x00001314 = fVar157;
    register0x00001318 = fVar157;
    register0x0000131c = fVar157;
    auVar75 = vfmadd231ps_fma(_local_900,_local_720,_DAT_01faff20);
    auVar86 = vsubps_avx(auVar218._0_32_,ZEXT1632(auVar75));
    auVar84 = vmulps_avx512vl(auVar244._0_32_,ZEXT1632(auVar75));
    auVar87 = vmulps_avx512vl(auVar242._0_32_,ZEXT1632(auVar75));
    fVar142 = auVar75._0_4_;
    fVar128 = auVar75._4_4_;
    auVar41._4_4_ = auVar234._4_4_ * fVar128;
    auVar41._0_4_ = auVar234._0_4_ * fVar142;
    fVar153 = auVar75._8_4_;
    auVar41._8_4_ = auVar234._8_4_ * fVar153;
    fVar155 = auVar75._12_4_;
    auVar41._12_4_ = auVar234._12_4_ * fVar155;
    auVar41._16_4_ = auVar234._16_4_ * 0.0;
    auVar41._20_4_ = auVar234._20_4_ * 0.0;
    auVar41._24_4_ = auVar234._24_4_ * 0.0;
    auVar41._28_4_ = fVar157;
    auVar213._0_4_ = auVar235._0_4_ * fVar142;
    auVar213._4_4_ = auVar235._4_4_ * fVar128;
    auVar213._8_4_ = auVar235._8_4_ * fVar153;
    auVar213._12_4_ = auVar235._12_4_ * fVar155;
    auVar213._16_4_ = auVar235._16_4_ * 0.0;
    auVar213._20_4_ = auVar235._20_4_ * 0.0;
    auVar213._28_36_ = auVar218._28_36_;
    auVar213._24_4_ = auVar235._24_4_ * 0.0;
    auVar76 = vfmadd231ps_fma(auVar84,auVar86,auVar224._0_32_);
    auVar77 = vfmadd231ps_fma(auVar87,auVar86,auVar226._0_32_);
    auVar78 = vfmadd231ps_fma(auVar41,auVar86,auVar228._0_32_);
    auVar73 = vfmadd231ps_fma(auVar213._0_32_,auVar86,auVar231._0_32_);
    auVar84 = vmulps_avx512vl(auVar236._0_32_,ZEXT1632(auVar75));
    auVar91 = ZEXT1632(auVar75);
    auVar87 = vmulps_avx512vl(auVar237._0_32_,auVar91);
    auVar88 = vmulps_avx512vl(auVar238._0_32_,auVar91);
    auVar89 = vmulps_avx512vl(auVar239._0_32_,auVar91);
    auVar84 = vfmadd231ps_avx512vl(auVar84,auVar86,auVar244._0_32_);
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar86,auVar242._0_32_);
    auVar79 = vfmadd231ps_fma(auVar88,auVar86,auVar234._0_32_);
    auVar74 = vfmadd231ps_fma(auVar89,auVar86,auVar235._0_32_);
    auVar218._0_4_ = local_200 * fVar142;
    auVar218._4_4_ = fStack_1fc * fVar128;
    auVar218._8_4_ = fStack_1f8 * fVar153;
    auVar218._12_4_ = fStack_1f4 * fVar155;
    auVar218._16_4_ = fStack_1f0 * 0.0;
    auVar218._20_4_ = fStack_1ec * 0.0;
    auVar218._28_36_ = auVar231._28_36_;
    auVar218._24_4_ = fStack_1e8 * 0.0;
    auVar88 = vmulps_avx512vl(auVar240._0_32_,auVar91);
    auVar89 = vmulps_avx512vl(auVar241._0_32_,auVar91);
    auVar85 = vmulps_avx512vl(auVar243._0_32_,auVar91);
    auVar90 = vfmadd231ps_avx512vl(auVar218._0_32_,auVar86,auVar236._0_32_);
    auVar88 = vfmadd231ps_avx512vl(auVar88,auVar86,auVar237._0_32_);
    auVar89 = vfmadd231ps_avx512vl(auVar89,auVar86,auVar238._0_32_);
    auVar85 = vfmadd231ps_avx512vl(auVar85,auVar86,auVar239._0_32_);
    auVar224._0_4_ = fVar142 * auVar84._0_4_;
    auVar224._4_4_ = fVar128 * auVar84._4_4_;
    auVar224._8_4_ = fVar153 * auVar84._8_4_;
    auVar224._12_4_ = fVar155 * auVar84._12_4_;
    auVar224._16_4_ = auVar84._16_4_ * 0.0;
    auVar224._20_4_ = auVar84._20_4_ * 0.0;
    auVar224._28_36_ = auVar235._28_36_;
    auVar224._24_4_ = auVar84._24_4_ * 0.0;
    auVar91 = vmulps_avx512vl(auVar91,auVar87);
    auVar83 = ZEXT1632(auVar75);
    auVar92 = vmulps_avx512vl(auVar83,ZEXT1632(auVar79));
    auVar93 = vmulps_avx512vl(auVar83,ZEXT1632(auVar74));
    auVar75 = vfmadd231ps_fma(auVar224._0_32_,auVar86,ZEXT1632(auVar76));
    auVar91 = vfmadd231ps_avx512vl(auVar91,auVar86,ZEXT1632(auVar77));
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar86,ZEXT1632(auVar78));
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar86,ZEXT1632(auVar73));
    auVar216._0_4_ = auVar90._0_4_ * fVar142;
    auVar216._4_4_ = auVar90._4_4_ * fVar128;
    auVar216._8_4_ = auVar90._8_4_ * fVar153;
    auVar216._12_4_ = auVar90._12_4_ * fVar155;
    auVar216._16_4_ = auVar90._16_4_ * 0.0;
    auVar216._20_4_ = auVar90._20_4_ * 0.0;
    auVar216._24_4_ = auVar90._24_4_ * 0.0;
    auVar216._28_4_ = 0;
    auVar42._4_4_ = auVar88._4_4_ * fVar128;
    auVar42._0_4_ = auVar88._0_4_ * fVar142;
    auVar42._8_4_ = auVar88._8_4_ * fVar153;
    auVar42._12_4_ = auVar88._12_4_ * fVar155;
    auVar42._16_4_ = auVar88._16_4_ * 0.0;
    auVar42._20_4_ = auVar88._20_4_ * 0.0;
    auVar42._24_4_ = auVar88._24_4_ * 0.0;
    auVar42._28_4_ = auVar90._28_4_;
    auVar43._4_4_ = auVar89._4_4_ * fVar128;
    auVar43._0_4_ = auVar89._0_4_ * fVar142;
    auVar43._8_4_ = auVar89._8_4_ * fVar153;
    auVar43._12_4_ = auVar89._12_4_ * fVar155;
    auVar43._16_4_ = auVar89._16_4_ * 0.0;
    auVar43._20_4_ = auVar89._20_4_ * 0.0;
    auVar43._24_4_ = auVar89._24_4_ * 0.0;
    auVar43._28_4_ = auVar88._28_4_;
    auVar44._4_4_ = auVar85._4_4_ * fVar128;
    auVar44._0_4_ = auVar85._0_4_ * fVar142;
    auVar44._8_4_ = auVar85._8_4_ * fVar153;
    auVar44._12_4_ = auVar85._12_4_ * fVar155;
    auVar44._16_4_ = auVar85._16_4_ * 0.0;
    auVar44._20_4_ = auVar85._20_4_ * 0.0;
    auVar44._24_4_ = auVar85._24_4_ * 0.0;
    auVar44._28_4_ = auVar89._28_4_;
    auVar76 = vfmadd231ps_fma(auVar216,auVar86,auVar84);
    auVar77 = vfmadd231ps_fma(auVar42,auVar86,auVar87);
    auVar78 = vfmadd231ps_fma(auVar43,auVar86,ZEXT1632(auVar79));
    auVar73 = vfmadd231ps_fma(auVar44,auVar86,ZEXT1632(auVar74));
    auVar84 = vmulps_avx512vl(auVar83,ZEXT1632(auVar77));
    auVar87 = vmulps_avx512vl(auVar83,ZEXT1632(auVar78));
    auVar79 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar155 * auVar76._12_4_,
                                                 CONCAT48(fVar153 * auVar76._8_4_,
                                                          CONCAT44(fVar128 * auVar76._4_4_,
                                                                   fVar142 * auVar76._0_4_)))),
                              auVar86,ZEXT1632(auVar75));
    local_460 = vfmadd231ps_avx512vl(auVar84,auVar86,auVar91);
    local_640 = vfmadd231ps_avx512vl(auVar87,auVar86,auVar92);
    auVar87 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar73._12_4_ * fVar155,
                                            CONCAT48(auVar73._8_4_ * fVar153,
                                                     CONCAT44(auVar73._4_4_ * fVar128,
                                                              auVar73._0_4_ * fVar142)))),auVar93,
                         auVar86);
    auVar86 = vsubps_avx(ZEXT1632(auVar76),ZEXT1632(auVar75));
    auVar84 = vsubps_avx512vl(ZEXT1632(auVar77),auVar91);
    auVar88 = vsubps_avx512vl(ZEXT1632(auVar78),auVar92);
    auVar89 = vsubps_avx512vl(ZEXT1632(auVar73),auVar93);
    auVar229._0_4_ = fVar141 * auVar86._0_4_ * 3.0;
    auVar229._4_4_ = fVar141 * auVar86._4_4_ * 3.0;
    auVar229._8_4_ = fVar141 * auVar86._8_4_ * 3.0;
    auVar229._12_4_ = fVar141 * auVar86._12_4_ * 3.0;
    auVar229._16_4_ = fVar141 * auVar86._16_4_ * 3.0;
    auVar229._20_4_ = fVar141 * auVar86._20_4_ * 3.0;
    auVar229._24_4_ = fVar141 * auVar86._24_4_ * 3.0;
    auVar229._28_4_ = 0;
    auVar232._0_4_ = fVar141 * auVar84._0_4_ * 3.0;
    auVar232._4_4_ = fVar141 * auVar84._4_4_ * 3.0;
    auVar232._8_4_ = fVar141 * auVar84._8_4_ * 3.0;
    auVar232._12_4_ = fVar141 * auVar84._12_4_ * 3.0;
    auVar232._16_4_ = fVar141 * auVar84._16_4_ * 3.0;
    auVar232._20_4_ = fVar141 * auVar84._20_4_ * 3.0;
    auVar232._24_4_ = fVar141 * auVar84._24_4_ * 3.0;
    auVar232._28_4_ = 0;
    auVar233._0_4_ = fVar141 * auVar88._0_4_ * 3.0;
    auVar233._4_4_ = fVar141 * auVar88._4_4_ * 3.0;
    auVar233._8_4_ = fVar141 * auVar88._8_4_ * 3.0;
    auVar233._12_4_ = fVar141 * auVar88._12_4_ * 3.0;
    auVar233._16_4_ = fVar141 * auVar88._16_4_ * 3.0;
    auVar233._20_4_ = fVar141 * auVar88._20_4_ * 3.0;
    auVar233._24_4_ = fVar141 * auVar88._24_4_ * 3.0;
    auVar233._28_4_ = 0;
    fVar142 = auVar89._0_4_ * 3.0 * fVar141;
    fVar128 = auVar89._4_4_ * 3.0 * fVar141;
    auVar45._4_4_ = fVar128;
    auVar45._0_4_ = fVar142;
    fVar153 = auVar89._8_4_ * 3.0 * fVar141;
    auVar45._8_4_ = fVar153;
    fVar155 = auVar89._12_4_ * 3.0 * fVar141;
    auVar45._12_4_ = fVar155;
    fVar157 = auVar89._16_4_ * 3.0 * fVar141;
    auVar45._16_4_ = fVar157;
    fVar159 = auVar89._20_4_ * 3.0 * fVar141;
    auVar45._20_4_ = fVar159;
    fVar161 = auVar89._24_4_ * 3.0 * fVar141;
    auVar45._24_4_ = fVar161;
    auVar45._28_4_ = fVar141;
    auVar75 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
    in_ZMM31 = ZEXT1664(auVar75);
    auVar89 = vpermt2ps_avx512vl(ZEXT1632(auVar79),_DAT_01feed00,ZEXT1632(auVar75));
    auVar85 = vpermt2ps_avx512vl(local_460,_DAT_01feed00,ZEXT1632(auVar75));
    auVar88 = ZEXT1632(auVar75);
    auVar90 = vpermt2ps_avx512vl(local_640,_DAT_01feed00,auVar88);
    auVar211._0_4_ = auVar87._0_4_ + fVar142;
    auVar211._4_4_ = auVar87._4_4_ + fVar128;
    auVar211._8_4_ = auVar87._8_4_ + fVar153;
    auVar211._12_4_ = auVar87._12_4_ + fVar155;
    auVar211._16_4_ = auVar87._16_4_ + fVar157;
    auVar211._20_4_ = auVar87._20_4_ + fVar159;
    auVar211._24_4_ = auVar87._24_4_ + fVar161;
    auVar211._28_4_ = auVar87._28_4_ + fVar141;
    auVar86 = vmaxps_avx(auVar87,auVar211);
    auVar84 = vminps_avx(auVar87,auVar211);
    auVar91 = vpermt2ps_avx512vl(auVar87,_DAT_01feed00,auVar88);
    auVar92 = vpermt2ps_avx512vl(auVar229,_DAT_01feed00,auVar88);
    auVar93 = vpermt2ps_avx512vl(auVar232,_DAT_01feed00,auVar88);
    auVar103 = ZEXT1632(auVar75);
    auVar83 = vpermt2ps_avx512vl(auVar233,_DAT_01feed00,auVar103);
    auVar87 = vpermt2ps_avx512vl(auVar45,_DAT_01feed00,auVar103);
    auVar87 = vsubps_avx(auVar91,auVar87);
    auVar88 = vsubps_avx(auVar89,ZEXT1632(auVar79));
    auVar94 = vsubps_avx512vl(auVar85,local_460);
    auVar95 = vsubps_avx512vl(auVar90,local_640);
    auVar81 = vmulps_avx512vl(auVar94,auVar233);
    auVar81 = vfmsub231ps_avx512vl(auVar81,auVar232,auVar95);
    auVar82 = vmulps_avx512vl(auVar95,auVar229);
    auVar82 = vfmsub231ps_avx512vl(auVar82,auVar233,auVar88);
    auVar96 = vmulps_avx512vl(auVar88,auVar232);
    auVar96 = vfmsub231ps_avx512vl(auVar96,auVar229,auVar94);
    auVar96 = vmulps_avx512vl(auVar96,auVar96);
    auVar82 = vfmadd231ps_avx512vl(auVar96,auVar82,auVar82);
    auVar81 = vfmadd231ps_avx512vl(auVar82,auVar81,auVar81);
    auVar82 = vmulps_avx512vl(auVar95,auVar95);
    auVar82 = vfmadd231ps_avx512vl(auVar82,auVar94,auVar94);
    auVar82 = vfmadd231ps_avx512vl(auVar82,auVar88,auVar88);
    auVar96 = vrcp14ps_avx512vl(auVar82);
    auVar97 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar98 = vfnmadd213ps_avx512vl(auVar96,auVar82,auVar97);
    auVar96 = vfmadd132ps_avx512vl(auVar98,auVar96,auVar96);
    auVar81 = vmulps_avx512vl(auVar81,auVar96);
    auVar98 = vmulps_avx512vl(auVar94,auVar83);
    auVar98 = vfmsub231ps_avx512vl(auVar98,auVar93,auVar95);
    auVar99 = vmulps_avx512vl(auVar95,auVar92);
    auVar99 = vfmsub231ps_avx512vl(auVar99,auVar83,auVar88);
    auVar100 = vmulps_avx512vl(auVar88,auVar93);
    auVar100 = vfmsub231ps_avx512vl(auVar100,auVar92,auVar94);
    auVar100 = vmulps_avx512vl(auVar100,auVar100);
    auVar99 = vfmadd231ps_avx512vl(auVar100,auVar99,auVar99);
    auVar98 = vfmadd231ps_avx512vl(auVar99,auVar98,auVar98);
    auVar96 = vmulps_avx512vl(auVar98,auVar96);
    auVar81 = vmaxps_avx512vl(auVar81,auVar96);
    auVar81 = vsqrtps_avx512vl(auVar81);
    auVar96 = vmaxps_avx512vl(auVar87,auVar91);
    auVar86 = vmaxps_avx512vl(auVar86,auVar96);
    auVar96 = vaddps_avx512vl(auVar81,auVar86);
    auVar86 = vminps_avx(auVar87,auVar91);
    auVar86 = vminps_avx(auVar84,auVar86);
    auVar86 = vsubps_avx512vl(auVar86,auVar81);
    auVar31._8_4_ = 0x3f800002;
    auVar31._0_8_ = 0x3f8000023f800002;
    auVar31._12_4_ = 0x3f800002;
    auVar31._16_4_ = 0x3f800002;
    auVar31._20_4_ = 0x3f800002;
    auVar31._24_4_ = 0x3f800002;
    auVar31._28_4_ = 0x3f800002;
    auVar84 = vmulps_avx512vl(auVar96,auVar31);
    auVar32._8_4_ = 0x3f7ffffc;
    auVar32._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar32._12_4_ = 0x3f7ffffc;
    auVar32._16_4_ = 0x3f7ffffc;
    auVar32._20_4_ = 0x3f7ffffc;
    auVar32._24_4_ = 0x3f7ffffc;
    auVar32._28_4_ = 0x3f7ffffc;
    local_600 = vmulps_avx512vl(auVar86,auVar32);
    auVar86 = vmulps_avx512vl(auVar84,auVar84);
    auVar84 = vrsqrt14ps_avx512vl(auVar82);
    auVar33._8_4_ = 0xbf000000;
    auVar33._0_8_ = 0xbf000000bf000000;
    auVar33._12_4_ = 0xbf000000;
    auVar33._16_4_ = 0xbf000000;
    auVar33._20_4_ = 0xbf000000;
    auVar33._24_4_ = 0xbf000000;
    auVar33._28_4_ = 0xbf000000;
    auVar87 = vmulps_avx512vl(auVar82,auVar33);
    fVar142 = auVar84._0_4_;
    fVar128 = auVar84._4_4_;
    fVar153 = auVar84._8_4_;
    fVar155 = auVar84._12_4_;
    fVar141 = auVar84._16_4_;
    fVar157 = auVar84._20_4_;
    fVar159 = auVar84._24_4_;
    auVar46._4_4_ = fVar128 * fVar128 * fVar128 * auVar87._4_4_;
    auVar46._0_4_ = fVar142 * fVar142 * fVar142 * auVar87._0_4_;
    auVar46._8_4_ = fVar153 * fVar153 * fVar153 * auVar87._8_4_;
    auVar46._12_4_ = fVar155 * fVar155 * fVar155 * auVar87._12_4_;
    auVar46._16_4_ = fVar141 * fVar141 * fVar141 * auVar87._16_4_;
    auVar46._20_4_ = fVar157 * fVar157 * fVar157 * auVar87._20_4_;
    auVar46._24_4_ = fVar159 * fVar159 * fVar159 * auVar87._24_4_;
    auVar46._28_4_ = auVar96._28_4_;
    auVar34._8_4_ = 0x3fc00000;
    auVar34._0_8_ = 0x3fc000003fc00000;
    auVar34._12_4_ = 0x3fc00000;
    auVar34._16_4_ = 0x3fc00000;
    auVar34._20_4_ = 0x3fc00000;
    auVar34._24_4_ = 0x3fc00000;
    auVar34._28_4_ = 0x3fc00000;
    auVar84 = vfmadd231ps_avx512vl(auVar46,auVar84,auVar34);
    auVar87 = vmulps_avx512vl(auVar88,auVar84);
    auVar91 = vmulps_avx512vl(auVar94,auVar84);
    auVar81 = vmulps_avx512vl(auVar95,auVar84);
    auVar203 = ZEXT1632(auVar79);
    auVar82 = vsubps_avx512vl(auVar103,auVar203);
    auVar96 = vsubps_avx512vl(auVar103,local_460);
    auVar98 = vsubps_avx512vl(auVar103,local_640);
    auVar99 = vmulps_avx512vl(local_7a0,auVar98);
    auVar99 = vfmadd231ps_avx512vl(auVar99,local_380,auVar96);
    auVar99 = vfmadd231ps_avx512vl(auVar99,local_620,auVar82);
    auVar100 = vmulps_avx512vl(auVar98,auVar98);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar96,auVar96);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar82,auVar82);
    auVar101 = vmulps_avx512vl(local_7a0,auVar81);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar91,local_380);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar87,local_620);
    auVar81 = vmulps_avx512vl(auVar98,auVar81);
    auVar91 = vfmadd231ps_avx512vl(auVar81,auVar96,auVar91);
    auVar87 = vfmadd231ps_avx512vl(auVar91,auVar82,auVar87);
    auVar91 = vmulps_avx512vl(auVar101,auVar101);
    auVar81 = vsubps_avx512vl(local_220,auVar91);
    auVar102 = vmulps_avx512vl(auVar101,auVar87);
    auVar99 = vsubps_avx512vl(auVar99,auVar102);
    auVar99 = vaddps_avx512vl(auVar99,auVar99);
    auVar102 = vmulps_avx512vl(auVar87,auVar87);
    local_560 = vsubps_avx512vl(auVar100,auVar102);
    auVar86 = vsubps_avx512vl(local_560,auVar86);
    local_3c0 = vmulps_avx512vl(auVar99,auVar99);
    auVar35._8_4_ = 0x40800000;
    auVar35._0_8_ = 0x4080000040800000;
    auVar35._12_4_ = 0x40800000;
    auVar35._16_4_ = 0x40800000;
    auVar35._20_4_ = 0x40800000;
    auVar35._24_4_ = 0x40800000;
    auVar35._28_4_ = 0x40800000;
    _local_3e0 = vmulps_avx512vl(auVar81,auVar35);
    auVar100 = vmulps_avx512vl(_local_3e0,auVar86);
    auVar100 = vsubps_avx512vl(local_3c0,auVar100);
    uVar66 = vcmpps_avx512vl(auVar100,auVar103,5);
    bVar61 = (byte)uVar66;
    fVar142 = (float)local_960._0_4_;
    fVar128 = (float)local_960._4_4_;
    fVar153 = fStack_958;
    fVar155 = fStack_954;
    fVar141 = fStack_950;
    fVar157 = fStack_94c;
    fVar159 = fStack_948;
    fVar161 = fStack_944;
    if (bVar61 == 0) {
LAB_01d43534:
      auVar218 = ZEXT3264(auVar97);
      auVar224 = ZEXT3264(local_740);
      auVar226 = ZEXT3264(local_760);
      auVar228 = ZEXT3264(local_780);
      auVar231 = ZEXT3264(local_920);
      auVar244 = ZEXT3264(local_7c0);
      auVar242 = ZEXT3264(local_7e0);
      auVar234 = ZEXT3264(local_800);
      auVar235 = ZEXT3264(local_820);
      auVar236 = ZEXT3264(local_840);
      auVar237 = ZEXT3264(local_660);
      auVar238 = ZEXT3264(local_680);
      auVar239 = ZEXT3264(local_860);
      auVar240 = ZEXT3264(local_880);
      auVar241 = ZEXT3264(local_6a0);
      auVar243 = ZEXT3264(local_8a0);
    }
    else {
      auVar102 = _local_3e0;
      auVar100 = vsqrtps_avx512vl(auVar100);
      auVar103 = vaddps_avx512vl(auVar81,auVar81);
      local_580 = vrcp14ps_avx512vl(auVar103);
      auVar104 = vfnmadd213ps_avx512vl(local_580,auVar103,auVar97);
      auVar104 = vfmadd132ps_avx512vl(auVar104,local_580,local_580);
      auVar36._8_4_ = 0x80000000;
      auVar36._0_8_ = 0x8000000080000000;
      auVar36._12_4_ = 0x80000000;
      auVar36._16_4_ = 0x80000000;
      auVar36._20_4_ = 0x80000000;
      auVar36._24_4_ = 0x80000000;
      auVar36._28_4_ = 0x80000000;
      local_400 = vxorps_avx512vl(auVar99,auVar36);
      auVar105 = vsubps_avx512vl(local_400,auVar100);
      auVar105 = vmulps_avx512vl(auVar105,auVar104);
      in_ZMM31 = ZEXT3264(auVar105);
      auVar100 = vsubps_avx512vl(auVar100,auVar99);
      local_5a0 = vmulps_avx512vl(auVar100,auVar104);
      auVar100 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar100 = vblendmps_avx512vl(auVar100,auVar105);
      auVar106._0_4_ =
           (uint)(bVar61 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar104._0_4_;
      bVar69 = (bool)((byte)(uVar66 >> 1) & 1);
      auVar106._4_4_ = (uint)bVar69 * auVar100._4_4_ | (uint)!bVar69 * auVar104._4_4_;
      bVar69 = (bool)((byte)(uVar66 >> 2) & 1);
      auVar106._8_4_ = (uint)bVar69 * auVar100._8_4_ | (uint)!bVar69 * auVar104._8_4_;
      bVar69 = (bool)((byte)(uVar66 >> 3) & 1);
      auVar106._12_4_ = (uint)bVar69 * auVar100._12_4_ | (uint)!bVar69 * auVar104._12_4_;
      bVar69 = (bool)((byte)(uVar66 >> 4) & 1);
      auVar106._16_4_ = (uint)bVar69 * auVar100._16_4_ | (uint)!bVar69 * auVar104._16_4_;
      bVar69 = (bool)((byte)(uVar66 >> 5) & 1);
      auVar106._20_4_ = (uint)bVar69 * auVar100._20_4_ | (uint)!bVar69 * auVar104._20_4_;
      bVar69 = (bool)((byte)(uVar66 >> 6) & 1);
      auVar106._24_4_ = (uint)bVar69 * auVar100._24_4_ | (uint)!bVar69 * auVar104._24_4_;
      bVar69 = SUB81(uVar66 >> 7,0);
      auVar106._28_4_ = (uint)bVar69 * auVar100._28_4_ | (uint)!bVar69 * auVar104._28_4_;
      auVar100 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar104 = vblendmps_avx512vl(auVar100,local_5a0);
      auVar107._0_4_ =
           (uint)(bVar61 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar100._0_4_;
      bVar69 = (bool)((byte)(uVar66 >> 1) & 1);
      auVar107._4_4_ = (uint)bVar69 * auVar104._4_4_ | (uint)!bVar69 * auVar100._4_4_;
      bVar69 = (bool)((byte)(uVar66 >> 2) & 1);
      auVar107._8_4_ = (uint)bVar69 * auVar104._8_4_ | (uint)!bVar69 * auVar100._8_4_;
      bVar69 = (bool)((byte)(uVar66 >> 3) & 1);
      auVar107._12_4_ = (uint)bVar69 * auVar104._12_4_ | (uint)!bVar69 * auVar100._12_4_;
      bVar69 = (bool)((byte)(uVar66 >> 4) & 1);
      auVar107._16_4_ = (uint)bVar69 * auVar104._16_4_ | (uint)!bVar69 * auVar100._16_4_;
      bVar69 = (bool)((byte)(uVar66 >> 5) & 1);
      auVar107._20_4_ = (uint)bVar69 * auVar104._20_4_ | (uint)!bVar69 * auVar100._20_4_;
      bVar69 = (bool)((byte)(uVar66 >> 6) & 1);
      auVar107._24_4_ = (uint)bVar69 * auVar104._24_4_ | (uint)!bVar69 * auVar100._24_4_;
      bVar69 = SUB81(uVar66 >> 7,0);
      auVar107._28_4_ = (uint)bVar69 * auVar104._28_4_ | (uint)!bVar69 * auVar100._28_4_;
      auVar100 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar91,auVar100);
      local_420 = vmaxps_avx512vl(local_1e0,auVar100);
      auVar37._8_4_ = 0x36000000;
      auVar37._0_8_ = 0x3600000036000000;
      auVar37._12_4_ = 0x36000000;
      auVar37._16_4_ = 0x36000000;
      auVar37._20_4_ = 0x36000000;
      auVar37._24_4_ = 0x36000000;
      auVar37._28_4_ = 0x36000000;
      local_440 = vmulps_avx512vl(local_420,auVar37);
      vandps_avx512vl(auVar81,auVar100);
      uVar71 = vcmpps_avx512vl(local_440,local_440,1);
      uVar66 = uVar66 & uVar71;
      bVar64 = (byte)uVar66;
      if (bVar64 != 0) {
        uVar71 = vcmpps_avx512vl(auVar86,_DAT_01faff00,2);
        auVar86 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar91 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar81 = vblendmps_avx512vl(auVar86,auVar91);
        bVar63 = (byte)uVar71;
        uVar72 = (uint)(bVar63 & 1) * auVar81._0_4_ | (uint)!(bool)(bVar63 & 1) * local_440._0_4_;
        bVar69 = (bool)((byte)(uVar71 >> 1) & 1);
        uVar121 = (uint)bVar69 * auVar81._4_4_ | (uint)!bVar69 * local_440._4_4_;
        bVar69 = (bool)((byte)(uVar71 >> 2) & 1);
        uVar122 = (uint)bVar69 * auVar81._8_4_ | (uint)!bVar69 * local_440._8_4_;
        bVar69 = (bool)((byte)(uVar71 >> 3) & 1);
        uVar123 = (uint)bVar69 * auVar81._12_4_ | (uint)!bVar69 * local_440._12_4_;
        bVar69 = (bool)((byte)(uVar71 >> 4) & 1);
        uVar124 = (uint)bVar69 * auVar81._16_4_ | (uint)!bVar69 * local_440._16_4_;
        bVar69 = (bool)((byte)(uVar71 >> 5) & 1);
        uVar125 = (uint)bVar69 * auVar81._20_4_ | (uint)!bVar69 * local_440._20_4_;
        bVar69 = (bool)((byte)(uVar71 >> 6) & 1);
        uVar126 = (uint)bVar69 * auVar81._24_4_ | (uint)!bVar69 * local_440._24_4_;
        bVar69 = SUB81(uVar71 >> 7,0);
        uVar127 = (uint)bVar69 * auVar81._28_4_ | (uint)!bVar69 * local_440._28_4_;
        auVar106._0_4_ = (bVar64 & 1) * uVar72 | !(bool)(bVar64 & 1) * auVar106._0_4_;
        bVar69 = (bool)((byte)(uVar66 >> 1) & 1);
        auVar106._4_4_ = bVar69 * uVar121 | !bVar69 * auVar106._4_4_;
        bVar69 = (bool)((byte)(uVar66 >> 2) & 1);
        auVar106._8_4_ = bVar69 * uVar122 | !bVar69 * auVar106._8_4_;
        bVar69 = (bool)((byte)(uVar66 >> 3) & 1);
        auVar106._12_4_ = bVar69 * uVar123 | !bVar69 * auVar106._12_4_;
        bVar69 = (bool)((byte)(uVar66 >> 4) & 1);
        auVar106._16_4_ = bVar69 * uVar124 | !bVar69 * auVar106._16_4_;
        bVar69 = (bool)((byte)(uVar66 >> 5) & 1);
        auVar106._20_4_ = bVar69 * uVar125 | !bVar69 * auVar106._20_4_;
        bVar69 = (bool)((byte)(uVar66 >> 6) & 1);
        auVar106._24_4_ = bVar69 * uVar126 | !bVar69 * auVar106._24_4_;
        bVar69 = SUB81(uVar66 >> 7,0);
        auVar106._28_4_ = bVar69 * uVar127 | !bVar69 * auVar106._28_4_;
        auVar86 = vblendmps_avx512vl(auVar91,auVar86);
        bVar69 = (bool)((byte)(uVar71 >> 1) & 1);
        bVar8 = (bool)((byte)(uVar71 >> 2) & 1);
        bVar9 = (bool)((byte)(uVar71 >> 3) & 1);
        bVar10 = (bool)((byte)(uVar71 >> 4) & 1);
        bVar11 = (bool)((byte)(uVar71 >> 5) & 1);
        bVar12 = (bool)((byte)(uVar71 >> 6) & 1);
        bVar13 = SUB81(uVar71 >> 7,0);
        auVar107._0_4_ =
             (uint)(bVar64 & 1) *
             ((uint)(bVar63 & 1) * auVar86._0_4_ | !(bool)(bVar63 & 1) * uVar72) |
             !(bool)(bVar64 & 1) * auVar107._0_4_;
        bVar7 = (bool)((byte)(uVar66 >> 1) & 1);
        auVar107._4_4_ =
             (uint)bVar7 * ((uint)bVar69 * auVar86._4_4_ | !bVar69 * uVar121) |
             !bVar7 * auVar107._4_4_;
        bVar69 = (bool)((byte)(uVar66 >> 2) & 1);
        auVar107._8_4_ =
             (uint)bVar69 * ((uint)bVar8 * auVar86._8_4_ | !bVar8 * uVar122) |
             !bVar69 * auVar107._8_4_;
        bVar69 = (bool)((byte)(uVar66 >> 3) & 1);
        auVar107._12_4_ =
             (uint)bVar69 * ((uint)bVar9 * auVar86._12_4_ | !bVar9 * uVar123) |
             !bVar69 * auVar107._12_4_;
        bVar69 = (bool)((byte)(uVar66 >> 4) & 1);
        auVar107._16_4_ =
             (uint)bVar69 * ((uint)bVar10 * auVar86._16_4_ | !bVar10 * uVar124) |
             !bVar69 * auVar107._16_4_;
        bVar69 = (bool)((byte)(uVar66 >> 5) & 1);
        auVar107._20_4_ =
             (uint)bVar69 * ((uint)bVar11 * auVar86._20_4_ | !bVar11 * uVar125) |
             !bVar69 * auVar107._20_4_;
        bVar69 = (bool)((byte)(uVar66 >> 6) & 1);
        auVar107._24_4_ =
             (uint)bVar69 * ((uint)bVar12 * auVar86._24_4_ | !bVar12 * uVar126) |
             !bVar69 * auVar107._24_4_;
        bVar69 = SUB81(uVar66 >> 7,0);
        auVar107._28_4_ =
             (uint)bVar69 * ((uint)bVar13 * auVar86._28_4_ | !bVar13 * uVar127) |
             !bVar69 * auVar107._28_4_;
        bVar61 = (~bVar64 | bVar63) & bVar61;
      }
      if ((bVar61 & 0x7f) == 0) {
        auVar97._8_4_ = 0x3f800000;
        auVar97._0_8_ = 0x3f8000003f800000;
        auVar97._12_4_ = 0x3f800000;
        auVar97._16_4_ = 0x3f800000;
        auVar97._20_4_ = 0x3f800000;
        auVar97._24_4_ = 0x3f800000;
        auVar97._28_4_ = 0x3f800000;
        goto LAB_01d43534;
      }
      auVar91 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar83 = vxorps_avx512vl(auVar83,auVar91);
      auVar92 = vxorps_avx512vl(auVar92,auVar91);
      auVar93 = vxorps_avx512vl(auVar93,auVar91);
      auVar75 = vsubss_avx512f(ZEXT416((uint)(ray->org).field_0.m128[3]),local_540);
      auVar86 = vbroadcastss_avx512vl(auVar75);
      auVar86 = vmaxps_avx512vl(auVar86,auVar106);
      auVar75 = vsubss_avx512f(ZEXT416((uint)ray->tfar),local_540);
      auVar81 = vbroadcastss_avx512vl(auVar75);
      auVar81 = vminps_avx512vl(auVar81,auVar107);
      auVar98 = vmulps_avx512vl(auVar98,auVar233);
      auVar96 = vfmadd213ps_avx512vl(auVar96,auVar232,auVar98);
      auVar75 = vfmadd213ps_fma(auVar82,auVar229,auVar96);
      auVar82 = vmulps_avx512vl(local_7a0,auVar233);
      auVar76 = vfmadd231ps_fma(auVar82,auVar232,local_380);
      auVar82 = vfmadd231ps_avx512vl(ZEXT1632(auVar76),local_620,auVar229);
      auVar96 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar82,auVar96);
      auVar98 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar15 = vcmpps_avx512vl(auVar96,auVar98,1);
      auVar100 = vxorps_avx512vl(ZEXT1632(auVar75),auVar91);
      auVar104 = vrcp14ps_avx512vl(auVar82);
      auVar108 = vxorps_avx512vl(auVar82,auVar91);
      auVar97 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar109 = vfnmadd213ps_avx512vl(auVar104,auVar82,auVar97);
      auVar75 = vfmadd132ps_fma(auVar109,auVar104,auVar104);
      fVar185 = auVar75._0_4_ * auVar100._0_4_;
      fVar152 = auVar75._4_4_ * auVar100._4_4_;
      auVar47._4_4_ = fVar152;
      auVar47._0_4_ = fVar185;
      fVar154 = auVar75._8_4_ * auVar100._8_4_;
      auVar47._8_4_ = fVar154;
      fVar156 = auVar75._12_4_ * auVar100._12_4_;
      auVar47._12_4_ = fVar156;
      fVar158 = auVar100._16_4_ * 0.0;
      auVar47._16_4_ = fVar158;
      fVar160 = auVar100._20_4_ * 0.0;
      auVar47._20_4_ = fVar160;
      fVar162 = auVar100._24_4_ * 0.0;
      auVar47._24_4_ = fVar162;
      auVar47._28_4_ = auVar100._28_4_;
      uVar17 = vcmpps_avx512vl(auVar82,auVar108,1);
      bVar64 = (byte)uVar15 | (byte)uVar17;
      auVar109 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar110 = vblendmps_avx512vl(auVar47,auVar109);
      auVar111._0_4_ =
           (uint)(bVar64 & 1) * auVar110._0_4_ | (uint)!(bool)(bVar64 & 1) * auVar104._0_4_;
      bVar69 = (bool)(bVar64 >> 1 & 1);
      auVar111._4_4_ = (uint)bVar69 * auVar110._4_4_ | (uint)!bVar69 * auVar104._4_4_;
      bVar69 = (bool)(bVar64 >> 2 & 1);
      auVar111._8_4_ = (uint)bVar69 * auVar110._8_4_ | (uint)!bVar69 * auVar104._8_4_;
      bVar69 = (bool)(bVar64 >> 3 & 1);
      auVar111._12_4_ = (uint)bVar69 * auVar110._12_4_ | (uint)!bVar69 * auVar104._12_4_;
      bVar69 = (bool)(bVar64 >> 4 & 1);
      auVar111._16_4_ = (uint)bVar69 * auVar110._16_4_ | (uint)!bVar69 * auVar104._16_4_;
      bVar69 = (bool)(bVar64 >> 5 & 1);
      auVar111._20_4_ = (uint)bVar69 * auVar110._20_4_ | (uint)!bVar69 * auVar104._20_4_;
      bVar69 = (bool)(bVar64 >> 6 & 1);
      auVar111._24_4_ = (uint)bVar69 * auVar110._24_4_ | (uint)!bVar69 * auVar104._24_4_;
      auVar111._28_4_ =
           (uint)(bVar64 >> 7) * auVar110._28_4_ | (uint)!(bool)(bVar64 >> 7) * auVar104._28_4_;
      auVar104 = vmaxps_avx512vl(auVar86,auVar111);
      uVar17 = vcmpps_avx512vl(auVar82,auVar108,6);
      bVar64 = (byte)uVar15 | (byte)uVar17;
      auVar82 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar112._0_4_ = (uint)(bVar64 & 1) * auVar82._0_4_ | (uint)!(bool)(bVar64 & 1) * (int)fVar185
      ;
      bVar69 = (bool)(bVar64 >> 1 & 1);
      auVar112._4_4_ = (uint)bVar69 * auVar82._4_4_ | (uint)!bVar69 * (int)fVar152;
      bVar69 = (bool)(bVar64 >> 2 & 1);
      auVar112._8_4_ = (uint)bVar69 * auVar82._8_4_ | (uint)!bVar69 * (int)fVar154;
      bVar69 = (bool)(bVar64 >> 3 & 1);
      auVar112._12_4_ = (uint)bVar69 * auVar82._12_4_ | (uint)!bVar69 * (int)fVar156;
      bVar69 = (bool)(bVar64 >> 4 & 1);
      auVar112._16_4_ = (uint)bVar69 * auVar82._16_4_ | (uint)!bVar69 * (int)fVar158;
      bVar69 = (bool)(bVar64 >> 5 & 1);
      auVar112._20_4_ = (uint)bVar69 * auVar82._20_4_ | (uint)!bVar69 * (int)fVar160;
      bVar69 = (bool)(bVar64 >> 6 & 1);
      auVar112._24_4_ = (uint)bVar69 * auVar82._24_4_ | (uint)!bVar69 * (int)fVar162;
      auVar112._28_4_ =
           (uint)(bVar64 >> 7) * auVar82._28_4_ | (uint)!(bool)(bVar64 >> 7) * auVar100._28_4_;
      auVar81 = vminps_avx512vl(auVar81,auVar112);
      auVar86 = vsubps_avx(ZEXT832(0) << 0x20,auVar89);
      auVar89 = vsubps_avx(ZEXT832(0) << 0x20,auVar85);
      auVar100 = ZEXT832(0) << 0x20;
      auVar85 = vsubps_avx(auVar100,auVar90);
      auVar85 = vmulps_avx512vl(auVar85,auVar83);
      auVar89 = vfmadd231ps_avx512vl(auVar85,auVar93,auVar89);
      auVar75 = vfmadd231ps_fma(auVar89,auVar92,auVar86);
      auVar86 = vmulps_avx512vl(local_7a0,auVar83);
      auVar86 = vfmadd231ps_avx512vl(auVar86,local_380,auVar93);
      auVar86 = vfmadd231ps_avx512vl(auVar86,local_620,auVar92);
      vandps_avx512vl(auVar86,auVar96);
      uVar15 = vcmpps_avx512vl(auVar86,auVar98,1);
      auVar89 = vxorps_avx512vl(ZEXT1632(auVar75),auVar91);
      auVar85 = vrcp14ps_avx512vl(auVar86);
      auVar90 = vxorps_avx512vl(auVar86,auVar91);
      auVar91 = vfnmadd213ps_avx512vl(auVar85,auVar86,auVar97);
      auVar75 = vfmadd132ps_fma(auVar91,auVar85,auVar85);
      fVar185 = auVar75._0_4_ * auVar89._0_4_;
      fVar152 = auVar75._4_4_ * auVar89._4_4_;
      auVar48._4_4_ = fVar152;
      auVar48._0_4_ = fVar185;
      fVar154 = auVar75._8_4_ * auVar89._8_4_;
      auVar48._8_4_ = fVar154;
      fVar156 = auVar75._12_4_ * auVar89._12_4_;
      auVar48._12_4_ = fVar156;
      fVar158 = auVar89._16_4_ * 0.0;
      auVar48._16_4_ = fVar158;
      fVar160 = auVar89._20_4_ * 0.0;
      auVar48._20_4_ = fVar160;
      fVar162 = auVar89._24_4_ * 0.0;
      auVar48._24_4_ = fVar162;
      auVar48._28_4_ = auVar89._28_4_;
      uVar17 = vcmpps_avx512vl(auVar86,auVar90,1);
      bVar64 = (byte)uVar15 | (byte)uVar17;
      auVar91 = vblendmps_avx512vl(auVar48,auVar109);
      auVar113._0_4_ =
           (uint)(bVar64 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar64 & 1) * auVar85._0_4_;
      bVar69 = (bool)(bVar64 >> 1 & 1);
      auVar113._4_4_ = (uint)bVar69 * auVar91._4_4_ | (uint)!bVar69 * auVar85._4_4_;
      bVar69 = (bool)(bVar64 >> 2 & 1);
      auVar113._8_4_ = (uint)bVar69 * auVar91._8_4_ | (uint)!bVar69 * auVar85._8_4_;
      bVar69 = (bool)(bVar64 >> 3 & 1);
      auVar113._12_4_ = (uint)bVar69 * auVar91._12_4_ | (uint)!bVar69 * auVar85._12_4_;
      bVar69 = (bool)(bVar64 >> 4 & 1);
      auVar113._16_4_ = (uint)bVar69 * auVar91._16_4_ | (uint)!bVar69 * auVar85._16_4_;
      bVar69 = (bool)(bVar64 >> 5 & 1);
      auVar113._20_4_ = (uint)bVar69 * auVar91._20_4_ | (uint)!bVar69 * auVar85._20_4_;
      bVar69 = (bool)(bVar64 >> 6 & 1);
      auVar113._24_4_ = (uint)bVar69 * auVar91._24_4_ | (uint)!bVar69 * auVar85._24_4_;
      auVar113._28_4_ =
           (uint)(bVar64 >> 7) * auVar91._28_4_ | (uint)!(bool)(bVar64 >> 7) * auVar85._28_4_;
      _local_6c0 = vmaxps_avx(auVar104,auVar113);
      uVar17 = vcmpps_avx512vl(auVar86,auVar90,6);
      bVar64 = (byte)uVar15 | (byte)uVar17;
      auVar114._0_4_ = (uint)(bVar64 & 1) * auVar82._0_4_ | (uint)!(bool)(bVar64 & 1) * (int)fVar185
      ;
      bVar69 = (bool)(bVar64 >> 1 & 1);
      auVar114._4_4_ = (uint)bVar69 * auVar82._4_4_ | (uint)!bVar69 * (int)fVar152;
      bVar69 = (bool)(bVar64 >> 2 & 1);
      auVar114._8_4_ = (uint)bVar69 * auVar82._8_4_ | (uint)!bVar69 * (int)fVar154;
      bVar69 = (bool)(bVar64 >> 3 & 1);
      auVar114._12_4_ = (uint)bVar69 * auVar82._12_4_ | (uint)!bVar69 * (int)fVar156;
      bVar69 = (bool)(bVar64 >> 4 & 1);
      auVar114._16_4_ = (uint)bVar69 * auVar82._16_4_ | (uint)!bVar69 * (int)fVar158;
      bVar69 = (bool)(bVar64 >> 5 & 1);
      auVar114._20_4_ = (uint)bVar69 * auVar82._20_4_ | (uint)!bVar69 * (int)fVar160;
      bVar69 = (bool)(bVar64 >> 6 & 1);
      auVar114._24_4_ = (uint)bVar69 * auVar82._24_4_ | (uint)!bVar69 * (int)fVar162;
      auVar114._28_4_ =
           (uint)(bVar64 >> 7) * auVar82._28_4_ | (uint)!(bool)(bVar64 >> 7) * auVar89._28_4_;
      local_2e0 = vminps_avx(auVar81,auVar114);
      auVar86 = _local_6c0;
      uVar15 = vcmpps_avx512vl(_local_6c0,local_2e0,2);
      bVar61 = bVar61 & 0x7f & (byte)uVar15;
      if (bVar61 == 0) goto LAB_01d43534;
      auVar89 = vmaxps_avx(auVar100,local_600);
      auVar85 = vfmadd213ps_avx512vl(auVar105,auVar101,auVar87);
      in_ZMM31 = ZEXT3264(auVar85);
      auVar85 = vmulps_avx512vl(auVar84,auVar85);
      auVar90 = vfmadd213ps_avx512vl(local_5a0,auVar101,auVar87);
      fVar185 = auVar84._0_4_;
      fVar152 = auVar84._4_4_;
      auVar49._4_4_ = fVar152 * auVar90._4_4_;
      auVar49._0_4_ = fVar185 * auVar90._0_4_;
      fVar154 = auVar84._8_4_;
      auVar49._8_4_ = fVar154 * auVar90._8_4_;
      fVar156 = auVar84._12_4_;
      auVar49._12_4_ = fVar156 * auVar90._12_4_;
      fVar158 = auVar84._16_4_;
      auVar49._16_4_ = fVar158 * auVar90._16_4_;
      fVar160 = auVar84._20_4_;
      auVar49._20_4_ = fVar160 * auVar90._20_4_;
      fVar162 = auVar84._24_4_;
      auVar49._24_4_ = fVar162 * auVar90._24_4_;
      auVar49._28_4_ = auVar90._28_4_;
      auVar85 = vminps_avx512vl(auVar85,auVar97);
      auVar90 = SUB6432(ZEXT864(0),0) << 0x20;
      auVar85 = vmaxps_avx(auVar85,ZEXT832(0) << 0x20);
      auVar91 = vminps_avx512vl(auVar49,auVar97);
      auVar50._4_4_ = (auVar85._4_4_ + 1.0) * 0.125;
      auVar50._0_4_ = (auVar85._0_4_ + 0.0) * 0.125;
      auVar50._8_4_ = (auVar85._8_4_ + 2.0) * 0.125;
      auVar50._12_4_ = (auVar85._12_4_ + 3.0) * 0.125;
      auVar50._16_4_ = (auVar85._16_4_ + 4.0) * 0.125;
      auVar50._20_4_ = (auVar85._20_4_ + 5.0) * 0.125;
      auVar50._24_4_ = (auVar85._24_4_ + 6.0) * 0.125;
      auVar50._28_4_ = auVar85._28_4_ + 7.0;
      local_1a0 = vfmadd213ps_avx512vl(auVar50,_local_720,_local_900);
      auVar85 = vmaxps_avx(auVar91,ZEXT832(0) << 0x20);
      auVar51._4_4_ = (auVar85._4_4_ + 1.0) * 0.125;
      auVar51._0_4_ = (auVar85._0_4_ + 0.0) * 0.125;
      auVar51._8_4_ = (auVar85._8_4_ + 2.0) * 0.125;
      auVar51._12_4_ = (auVar85._12_4_ + 3.0) * 0.125;
      auVar51._16_4_ = (auVar85._16_4_ + 4.0) * 0.125;
      auVar51._20_4_ = (auVar85._20_4_ + 5.0) * 0.125;
      auVar51._24_4_ = (auVar85._24_4_ + 6.0) * 0.125;
      auVar51._28_4_ = auVar85._28_4_ + 7.0;
      local_1c0 = vfmadd213ps_avx512vl(auVar51,_local_720,_local_900);
      auVar52._4_4_ = auVar89._4_4_ * auVar89._4_4_;
      auVar52._0_4_ = auVar89._0_4_ * auVar89._0_4_;
      auVar52._8_4_ = auVar89._8_4_ * auVar89._8_4_;
      auVar52._12_4_ = auVar89._12_4_ * auVar89._12_4_;
      auVar52._16_4_ = auVar89._16_4_ * auVar89._16_4_;
      auVar52._20_4_ = auVar89._20_4_ * auVar89._20_4_;
      auVar52._24_4_ = auVar89._24_4_ * auVar89._24_4_;
      auVar52._28_4_ = auVar89._28_4_;
      auVar85 = vsubps_avx(local_560,auVar52);
      auVar53._4_4_ = auVar85._4_4_ * (float)local_3e0._4_4_;
      auVar53._0_4_ = auVar85._0_4_ * (float)local_3e0._0_4_;
      auVar53._8_4_ = auVar85._8_4_ * fStack_3d8;
      auVar53._12_4_ = auVar85._12_4_ * fStack_3d4;
      auVar53._16_4_ = auVar85._16_4_ * fStack_3d0;
      auVar53._20_4_ = auVar85._20_4_ * fStack_3cc;
      auVar53._24_4_ = auVar85._24_4_ * fStack_3c8;
      auVar53._28_4_ = auVar89._28_4_;
      auVar89 = vsubps_avx(local_3c0,auVar53);
      uVar66 = vcmpps_avx512vl(auVar89,ZEXT832(0) << 0x20,5);
      auVar241 = ZEXT3264(local_6a0);
      if ((byte)uVar66 == 0) {
        uVar66 = 0;
        auVar84 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar218 = ZEXT864(0) << 0x20;
        auVar89 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar91 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar225 = ZEXT1228(ZEXT812(0)) << 0x20;
        auVar115._8_4_ = 0x7f800000;
        auVar115._0_8_ = 0x7f8000007f800000;
        auVar115._12_4_ = 0x7f800000;
        auVar115._16_4_ = 0x7f800000;
        auVar115._20_4_ = 0x7f800000;
        auVar115._24_4_ = 0x7f800000;
        auVar115._28_4_ = 0x7f800000;
        auVar116._8_4_ = 0xff800000;
        auVar116._0_8_ = 0xff800000ff800000;
        auVar116._12_4_ = 0xff800000;
        auVar116._16_4_ = 0xff800000;
        auVar116._20_4_ = 0xff800000;
        auVar116._24_4_ = 0xff800000;
        auVar116._28_4_ = 0xff800000;
      }
      else {
        auVar76 = vxorps_avx512vl(auVar198,auVar198);
        uVar71 = vcmpps_avx512vl(auVar89,auVar100,5);
        auVar89 = vsqrtps_avx(auVar89);
        auVar90 = vfnmadd213ps_avx512vl(auVar103,local_580,auVar97);
        auVar92 = vfmadd132ps_avx512vl(auVar90,local_580,local_580);
        auVar90 = vsubps_avx(local_400,auVar89);
        auVar93 = vmulps_avx512vl(auVar90,auVar92);
        auVar89 = vsubps_avx512vl(auVar89,auVar99);
        auVar92 = vmulps_avx512vl(auVar89,auVar92);
        auVar89 = vfmadd213ps_avx512vl(auVar101,auVar93,auVar87);
        auVar54._4_4_ = fVar152 * auVar89._4_4_;
        auVar54._0_4_ = fVar185 * auVar89._0_4_;
        auVar54._8_4_ = fVar154 * auVar89._8_4_;
        auVar54._12_4_ = fVar156 * auVar89._12_4_;
        auVar54._16_4_ = fVar158 * auVar89._16_4_;
        auVar54._20_4_ = fVar160 * auVar89._20_4_;
        auVar54._24_4_ = fVar162 * auVar89._24_4_;
        auVar54._28_4_ = auVar91._28_4_;
        auVar89 = vmulps_avx512vl(local_620,auVar93);
        auVar90 = vmulps_avx512vl(local_380,auVar93);
        auVar83 = vmulps_avx512vl(local_7a0,auVar93);
        auVar91 = vfmadd213ps_avx512vl(auVar88,auVar54,auVar203);
        auVar89 = vsubps_avx512vl(auVar89,auVar91);
        auVar91 = vfmadd213ps_avx512vl(auVar94,auVar54,local_460);
        auVar91 = vsubps_avx512vl(auVar90,auVar91);
        auVar75 = vfmadd213ps_fma(auVar54,auVar95,local_640);
        auVar90 = vsubps_avx(auVar83,ZEXT1632(auVar75));
        auVar225 = auVar90._0_28_;
        auVar87 = vfmadd213ps_avx512vl(auVar101,auVar92,auVar87);
        auVar55._4_4_ = fVar152 * auVar87._4_4_;
        auVar55._0_4_ = fVar185 * auVar87._0_4_;
        auVar55._8_4_ = fVar154 * auVar87._8_4_;
        auVar55._12_4_ = fVar156 * auVar87._12_4_;
        auVar55._16_4_ = fVar158 * auVar87._16_4_;
        auVar55._20_4_ = fVar160 * auVar87._20_4_;
        auVar55._24_4_ = fVar162 * auVar87._24_4_;
        auVar55._28_4_ = auVar84._28_4_;
        auVar84 = vmulps_avx512vl(local_620,auVar92);
        auVar87 = vmulps_avx512vl(local_380,auVar92);
        auVar83 = vmulps_avx512vl(local_7a0,auVar92);
        auVar75 = vfmadd213ps_fma(auVar88,auVar55,auVar203);
        auVar90 = vsubps_avx(auVar84,ZEXT1632(auVar75));
        auVar84 = vfmadd213ps_avx512vl(auVar94,auVar55,local_460);
        auVar84 = vsubps_avx(auVar87,auVar84);
        auVar75 = vfmadd213ps_fma(auVar95,auVar55,local_640);
        auVar87 = vsubps_avx512vl(auVar83,ZEXT1632(auVar75));
        auVar218 = ZEXT3264(auVar87);
        auVar180._8_4_ = 0x7f800000;
        auVar180._0_8_ = 0x7f8000007f800000;
        auVar180._12_4_ = 0x7f800000;
        auVar180._16_4_ = 0x7f800000;
        auVar180._20_4_ = 0x7f800000;
        auVar180._24_4_ = 0x7f800000;
        auVar180._28_4_ = 0x7f800000;
        auVar87 = vblendmps_avx512vl(auVar180,auVar93);
        bVar69 = (bool)((byte)uVar71 & 1);
        auVar115._0_4_ = (uint)bVar69 * auVar87._0_4_ | (uint)!bVar69 * 0x7f800000;
        bVar69 = (bool)((byte)(uVar71 >> 1) & 1);
        auVar115._4_4_ = (uint)bVar69 * auVar87._4_4_ | (uint)!bVar69 * 0x7f800000;
        bVar69 = (bool)((byte)(uVar71 >> 2) & 1);
        auVar115._8_4_ = (uint)bVar69 * auVar87._8_4_ | (uint)!bVar69 * 0x7f800000;
        bVar69 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar115._12_4_ = (uint)bVar69 * auVar87._12_4_ | (uint)!bVar69 * 0x7f800000;
        bVar69 = (bool)((byte)(uVar71 >> 4) & 1);
        auVar115._16_4_ = (uint)bVar69 * auVar87._16_4_ | (uint)!bVar69 * 0x7f800000;
        bVar69 = (bool)((byte)(uVar71 >> 5) & 1);
        auVar115._20_4_ = (uint)bVar69 * auVar87._20_4_ | (uint)!bVar69 * 0x7f800000;
        bVar69 = (bool)((byte)(uVar71 >> 6) & 1);
        auVar115._24_4_ = (uint)bVar69 * auVar87._24_4_ | (uint)!bVar69 * 0x7f800000;
        bVar69 = SUB81(uVar71 >> 7,0);
        auVar115._28_4_ = (uint)bVar69 * auVar87._28_4_ | (uint)!bVar69 * 0x7f800000;
        auVar204._8_4_ = 0xff800000;
        auVar204._0_8_ = 0xff800000ff800000;
        auVar204._12_4_ = 0xff800000;
        auVar204._16_4_ = 0xff800000;
        auVar204._20_4_ = 0xff800000;
        auVar204._24_4_ = 0xff800000;
        auVar204._28_4_ = 0xff800000;
        auVar87 = vblendmps_avx512vl(auVar204,auVar92);
        bVar69 = (bool)((byte)uVar71 & 1);
        auVar116._0_4_ = (uint)bVar69 * auVar87._0_4_ | (uint)!bVar69 * -0x800000;
        bVar69 = (bool)((byte)(uVar71 >> 1) & 1);
        auVar116._4_4_ = (uint)bVar69 * auVar87._4_4_ | (uint)!bVar69 * -0x800000;
        bVar69 = (bool)((byte)(uVar71 >> 2) & 1);
        auVar116._8_4_ = (uint)bVar69 * auVar87._8_4_ | (uint)!bVar69 * -0x800000;
        bVar69 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar116._12_4_ = (uint)bVar69 * auVar87._12_4_ | (uint)!bVar69 * -0x800000;
        bVar69 = (bool)((byte)(uVar71 >> 4) & 1);
        auVar116._16_4_ = (uint)bVar69 * auVar87._16_4_ | (uint)!bVar69 * -0x800000;
        bVar69 = (bool)((byte)(uVar71 >> 5) & 1);
        auVar116._20_4_ = (uint)bVar69 * auVar87._20_4_ | (uint)!bVar69 * -0x800000;
        bVar69 = (bool)((byte)(uVar71 >> 6) & 1);
        auVar116._24_4_ = (uint)bVar69 * auVar87._24_4_ | (uint)!bVar69 * -0x800000;
        bVar69 = SUB81(uVar71 >> 7,0);
        auVar116._28_4_ = (uint)bVar69 * auVar87._28_4_ | (uint)!bVar69 * -0x800000;
        auVar38._8_4_ = 0x36000000;
        auVar38._0_8_ = 0x3600000036000000;
        auVar38._12_4_ = 0x36000000;
        auVar38._16_4_ = 0x36000000;
        auVar38._20_4_ = 0x36000000;
        auVar38._24_4_ = 0x36000000;
        auVar38._28_4_ = 0x36000000;
        auVar87 = vmulps_avx512vl(local_420,auVar38);
        uVar16 = vcmpps_avx512vl(auVar87,local_440,0xe);
        uVar71 = uVar71 & uVar16;
        bVar64 = (byte)uVar71;
        if (bVar64 != 0) {
          uVar16 = vcmpps_avx512vl(auVar85,ZEXT1632(auVar76),2);
          auVar221._8_4_ = 0x7f800000;
          auVar221._0_8_ = 0x7f8000007f800000;
          auVar221._12_4_ = 0x7f800000;
          auVar221._16_4_ = 0x7f800000;
          auVar221._20_4_ = 0x7f800000;
          auVar221._24_4_ = 0x7f800000;
          auVar221._28_4_ = 0x7f800000;
          auVar230._8_4_ = 0xff800000;
          auVar230._0_8_ = 0xff800000ff800000;
          auVar230._12_4_ = 0xff800000;
          auVar230._16_4_ = 0xff800000;
          auVar230._20_4_ = 0xff800000;
          auVar230._24_4_ = 0xff800000;
          auVar230._28_4_ = 0xff800000;
          auVar88 = vblendmps_avx512vl(auVar221,auVar230);
          bVar63 = (byte)uVar16;
          uVar72 = (uint)(bVar63 & 1) * auVar88._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar87._0_4_;
          bVar69 = (bool)((byte)(uVar16 >> 1) & 1);
          uVar121 = (uint)bVar69 * auVar88._4_4_ | (uint)!bVar69 * auVar87._4_4_;
          bVar69 = (bool)((byte)(uVar16 >> 2) & 1);
          uVar122 = (uint)bVar69 * auVar88._8_4_ | (uint)!bVar69 * auVar87._8_4_;
          bVar69 = (bool)((byte)(uVar16 >> 3) & 1);
          uVar123 = (uint)bVar69 * auVar88._12_4_ | (uint)!bVar69 * auVar87._12_4_;
          bVar69 = (bool)((byte)(uVar16 >> 4) & 1);
          uVar124 = (uint)bVar69 * auVar88._16_4_ | (uint)!bVar69 * auVar87._16_4_;
          bVar69 = (bool)((byte)(uVar16 >> 5) & 1);
          uVar125 = (uint)bVar69 * auVar88._20_4_ | (uint)!bVar69 * auVar87._20_4_;
          bVar69 = (bool)((byte)(uVar16 >> 6) & 1);
          uVar126 = (uint)bVar69 * auVar88._24_4_ | (uint)!bVar69 * auVar87._24_4_;
          bVar69 = SUB81(uVar16 >> 7,0);
          uVar127 = (uint)bVar69 * auVar88._28_4_ | (uint)!bVar69 * auVar87._28_4_;
          auVar115._0_4_ = (bVar64 & 1) * uVar72 | !(bool)(bVar64 & 1) * auVar115._0_4_;
          bVar69 = (bool)((byte)(uVar71 >> 1) & 1);
          auVar115._4_4_ = bVar69 * uVar121 | !bVar69 * auVar115._4_4_;
          bVar69 = (bool)((byte)(uVar71 >> 2) & 1);
          auVar115._8_4_ = bVar69 * uVar122 | !bVar69 * auVar115._8_4_;
          bVar69 = (bool)((byte)(uVar71 >> 3) & 1);
          auVar115._12_4_ = bVar69 * uVar123 | !bVar69 * auVar115._12_4_;
          bVar69 = (bool)((byte)(uVar71 >> 4) & 1);
          auVar115._16_4_ = bVar69 * uVar124 | !bVar69 * auVar115._16_4_;
          bVar69 = (bool)((byte)(uVar71 >> 5) & 1);
          auVar115._20_4_ = bVar69 * uVar125 | !bVar69 * auVar115._20_4_;
          bVar69 = (bool)((byte)(uVar71 >> 6) & 1);
          auVar115._24_4_ = bVar69 * uVar126 | !bVar69 * auVar115._24_4_;
          bVar69 = SUB81(uVar71 >> 7,0);
          auVar115._28_4_ = bVar69 * uVar127 | !bVar69 * auVar115._28_4_;
          auVar87 = vblendmps_avx512vl(auVar230,auVar221);
          bVar69 = (bool)((byte)(uVar16 >> 1) & 1);
          bVar8 = (bool)((byte)(uVar16 >> 2) & 1);
          bVar9 = (bool)((byte)(uVar16 >> 3) & 1);
          bVar10 = (bool)((byte)(uVar16 >> 4) & 1);
          bVar11 = (bool)((byte)(uVar16 >> 5) & 1);
          bVar12 = (bool)((byte)(uVar16 >> 6) & 1);
          bVar13 = SUB81(uVar16 >> 7,0);
          auVar116._0_4_ =
               (uint)(bVar64 & 1) *
               ((uint)(bVar63 & 1) * auVar87._0_4_ | !(bool)(bVar63 & 1) * uVar72) |
               !(bool)(bVar64 & 1) * auVar116._0_4_;
          bVar7 = (bool)((byte)(uVar71 >> 1) & 1);
          auVar116._4_4_ =
               (uint)bVar7 * ((uint)bVar69 * auVar87._4_4_ | !bVar69 * uVar121) |
               !bVar7 * auVar116._4_4_;
          bVar69 = (bool)((byte)(uVar71 >> 2) & 1);
          auVar116._8_4_ =
               (uint)bVar69 * ((uint)bVar8 * auVar87._8_4_ | !bVar8 * uVar122) |
               !bVar69 * auVar116._8_4_;
          bVar69 = (bool)((byte)(uVar71 >> 3) & 1);
          auVar116._12_4_ =
               (uint)bVar69 * ((uint)bVar9 * auVar87._12_4_ | !bVar9 * uVar123) |
               !bVar69 * auVar116._12_4_;
          bVar69 = (bool)((byte)(uVar71 >> 4) & 1);
          auVar116._16_4_ =
               (uint)bVar69 * ((uint)bVar10 * auVar87._16_4_ | !bVar10 * uVar124) |
               !bVar69 * auVar116._16_4_;
          bVar69 = (bool)((byte)(uVar71 >> 5) & 1);
          auVar116._20_4_ =
               (uint)bVar69 * ((uint)bVar11 * auVar87._20_4_ | !bVar11 * uVar125) |
               !bVar69 * auVar116._20_4_;
          bVar69 = (bool)((byte)(uVar71 >> 6) & 1);
          auVar116._24_4_ =
               (uint)bVar69 * ((uint)bVar12 * auVar87._24_4_ | !bVar12 * uVar126) |
               !bVar69 * auVar116._24_4_;
          bVar69 = SUB81(uVar71 >> 7,0);
          auVar116._28_4_ =
               (uint)bVar69 * ((uint)bVar13 * auVar87._28_4_ | !bVar13 * uVar127) |
               !bVar69 * auVar116._28_4_;
          uVar66 = (ulong)(byte)((~bVar64 | bVar63) & (byte)uVar66);
        }
      }
      auVar244 = ZEXT3264(local_7c0);
      auVar242 = ZEXT3264(local_7e0);
      auVar234 = ZEXT3264(local_800);
      auVar235 = ZEXT3264(local_820);
      auVar236 = ZEXT3264(local_840);
      auVar239 = ZEXT3264(local_860);
      auVar240 = ZEXT3264(local_880);
      auVar243 = ZEXT3264(local_8a0);
      uVar129 = *(undefined4 *)&(ray->dir).field_0;
      auVar217._4_4_ = uVar129;
      auVar217._0_4_ = uVar129;
      auVar217._8_4_ = uVar129;
      auVar217._12_4_ = uVar129;
      auVar217._16_4_ = uVar129;
      auVar217._20_4_ = uVar129;
      auVar217._24_4_ = uVar129;
      auVar217._28_4_ = uVar129;
      uVar129 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
      auVar222._4_4_ = uVar129;
      auVar222._0_4_ = uVar129;
      auVar222._8_4_ = uVar129;
      auVar222._12_4_ = uVar129;
      auVar222._16_4_ = uVar129;
      auVar222._20_4_ = uVar129;
      auVar222._24_4_ = uVar129;
      auVar222._28_4_ = uVar129;
      fVar185 = (ray->dir).field_0.m128[2];
      auVar226._0_4_ = fVar185 * auVar218._0_4_;
      auVar226._4_4_ = fVar185 * auVar218._4_4_;
      auVar226._8_4_ = fVar185 * auVar218._8_4_;
      auVar226._12_4_ = fVar185 * auVar218._12_4_;
      auVar226._16_4_ = fVar185 * auVar218._16_4_;
      auVar226._20_4_ = fVar185 * auVar218._20_4_;
      auVar226._28_36_ = auVar218._28_36_;
      auVar226._24_4_ = fVar185 * auVar218._24_4_;
      auVar75 = vfmadd231ps_fma(auVar226._0_32_,auVar222,auVar84);
      auVar75 = vfmadd231ps_fma(ZEXT1632(auVar75),auVar217,auVar90);
      auVar227._8_4_ = 0x7fffffff;
      auVar227._0_8_ = 0x7fffffff7fffffff;
      auVar227._12_4_ = 0x7fffffff;
      auVar227._16_4_ = 0x7fffffff;
      auVar227._20_4_ = 0x7fffffff;
      auVar227._24_4_ = 0x7fffffff;
      auVar227._28_4_ = 0x7fffffff;
      auVar84 = vandps_avx(auVar227,ZEXT1632(auVar75));
      _local_2c0 = _local_6c0;
      auVar212._8_4_ = 0x3e99999a;
      auVar212._0_8_ = 0x3e99999a3e99999a;
      auVar212._12_4_ = 0x3e99999a;
      auVar212._16_4_ = 0x3e99999a;
      auVar212._20_4_ = 0x3e99999a;
      auVar212._24_4_ = 0x3e99999a;
      auVar212._28_4_ = 0x3e99999a;
      uVar15 = vcmpps_avx512vl(auVar84,auVar212,1);
      local_3a0._0_2_ = (short)uVar15;
      local_300 = vmaxps_avx512vl(_local_6c0,auVar116);
      auVar84 = vminps_avx(local_2e0,auVar115);
      uVar15 = vcmpps_avx512vl(_local_6c0,auVar84,2);
      bVar64 = (byte)uVar15 & bVar61;
      uVar17 = vcmpps_avx512vl(local_300,local_2e0,2);
      auVar237 = ZEXT3264(local_660);
      auVar238 = ZEXT3264(local_680);
      if ((bVar61 & ((byte)uVar17 | (byte)uVar15)) == 0) {
        auVar218 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        auVar224 = ZEXT3264(local_740);
        auVar226 = ZEXT3264(local_760);
        auVar228 = ZEXT3264(local_780);
        auVar231 = ZEXT3264(local_920);
      }
      else {
        auVar56._4_4_ = auVar225._4_4_ * fVar185;
        auVar56._0_4_ = auVar225._0_4_ * fVar185;
        auVar56._8_4_ = auVar225._8_4_ * fVar185;
        auVar56._12_4_ = auVar225._12_4_ * fVar185;
        auVar56._16_4_ = auVar225._16_4_ * fVar185;
        auVar56._20_4_ = auVar225._20_4_ * fVar185;
        auVar56._24_4_ = auVar225._24_4_ * fVar185;
        auVar56._28_4_ = auVar84._28_4_;
        auVar75 = vfmadd213ps_fma(auVar91,auVar222,auVar56);
        auVar75 = vfmadd213ps_fma(auVar89,auVar217,ZEXT1632(auVar75));
        auVar84 = vandps_avx(auVar227,ZEXT1632(auVar75));
        uVar15 = vcmpps_avx512vl(auVar84,auVar212,1);
        local_8a8 = (int)CONCAT71((int7)(uVar66 >> 8),~(byte)uVar66);
        bVar63 = (byte)uVar15 | ~(byte)uVar66;
        auVar137._8_4_ = 2;
        auVar137._0_8_ = 0x200000002;
        auVar137._12_4_ = 2;
        auVar137._16_4_ = 2;
        auVar137._20_4_ = 2;
        auVar137._24_4_ = 2;
        auVar137._28_4_ = 2;
        auVar39._8_4_ = 3;
        auVar39._0_8_ = 0x300000003;
        auVar39._12_4_ = 3;
        auVar39._16_4_ = 3;
        auVar39._20_4_ = 3;
        auVar39._24_4_ = 3;
        auVar39._28_4_ = 3;
        auVar84 = vpblendmd_avx512vl(auVar137,auVar39);
        local_260._0_4_ = (uint)(bVar63 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar63 & 1) * 2;
        bVar69 = (bool)(bVar63 >> 1 & 1);
        local_260._4_4_ = (uint)bVar69 * auVar84._4_4_ | (uint)!bVar69 * 2;
        bVar69 = (bool)(bVar63 >> 2 & 1);
        local_260._8_4_ = (uint)bVar69 * auVar84._8_4_ | (uint)!bVar69 * 2;
        bVar69 = (bool)(bVar63 >> 3 & 1);
        local_260._12_4_ = (uint)bVar69 * auVar84._12_4_ | (uint)!bVar69 * 2;
        bVar69 = (bool)(bVar63 >> 4 & 1);
        local_260._16_4_ = (uint)bVar69 * auVar84._16_4_ | (uint)!bVar69 * 2;
        bVar69 = (bool)(bVar63 >> 5 & 1);
        local_260._20_4_ = (uint)bVar69 * auVar84._20_4_ | (uint)!bVar69 * 2;
        bVar69 = (bool)(bVar63 >> 6 & 1);
        local_260._24_4_ = (uint)bVar69 * auVar84._24_4_ | (uint)!bVar69 * 2;
        local_260._28_4_ = (uint)(bVar63 >> 7) * auVar84._28_4_ | (uint)!(bool)(bVar63 >> 7) * 2;
        local_320 = vpbroadcastd_avx512vl();
        uVar15 = vpcmpd_avx512vl(local_320,local_260,5);
        local_8a4 = (uint)bVar64;
        bVar64 = (byte)uVar15 & bVar64;
        _local_3e0 = auVar102;
        if (bVar64 == 0) {
          fVar185 = ray->tfar;
          auVar139._4_4_ = fVar185;
          auVar139._0_4_ = fVar185;
          auVar139._8_4_ = fVar185;
          auVar139._12_4_ = fVar185;
          auVar139._16_4_ = fVar185;
          auVar139._20_4_ = fVar185;
          auVar139._24_4_ = fVar185;
          auVar139._28_4_ = fVar185;
          auVar218 = ZEXT3264(CONCAT428(0x3f800000,
                                        CONCAT424(0x3f800000,
                                                  CONCAT420(0x3f800000,
                                                            CONCAT416(0x3f800000,
                                                                      CONCAT412(0x3f800000,
                                                                                CONCAT48(0x3f800000,
                                                                                                                                                                                  
                                                  0x3f8000003f800000)))))));
          auVar86 = local_300;
        }
        else {
          local_280 = local_300;
          auVar76 = vminps_avx(local_480._0_16_,local_4c0._0_16_);
          auVar75 = vmaxps_avx(local_480._0_16_,local_4c0._0_16_);
          auVar77 = vminps_avx(local_4a0._0_16_,local_4e0._0_16_);
          auVar78 = vminps_avx(auVar76,auVar77);
          auVar76 = vmaxps_avx(local_4a0._0_16_,local_4e0._0_16_);
          auVar77 = vmaxps_avx(auVar75,auVar76);
          auVar163._8_4_ = 0x7fffffff;
          auVar163._0_8_ = 0x7fffffff7fffffff;
          auVar163._12_4_ = 0x7fffffff;
          auVar75 = vandps_avx(auVar78,auVar163);
          auVar76 = vandps_avx(auVar77,auVar163);
          auVar75 = vmaxps_avx(auVar75,auVar76);
          auVar76 = vmovshdup_avx(auVar75);
          auVar76 = vmaxss_avx(auVar76,auVar75);
          auVar75 = vshufpd_avx(auVar75,auVar75,1);
          auVar75 = vmaxss_avx(auVar75,auVar76);
          fVar185 = auVar75._0_4_ * 1.9073486e-06;
          local_530 = vshufps_avx(auVar77,auVar77,0xff);
          local_360 = (float)local_960._0_4_ + (float)local_6c0._0_4_;
          fStack_35c = (float)local_960._4_4_ + (float)local_6c0._4_4_;
          fStack_358 = fStack_958 + fStack_6b8;
          fStack_354 = fStack_954 + fStack_6b4;
          fStack_350 = fStack_950 + fStack_6b0;
          fStack_34c = fStack_94c + fStack_6ac;
          fStack_348 = fStack_948 + fStack_6a8;
          fStack_344 = fStack_944 + fStack_6a4;
          _local_6c0 = auVar86;
          do {
            auVar87 = _local_900;
            auVar138._8_4_ = 0x7f800000;
            auVar138._0_8_ = 0x7f8000007f800000;
            auVar138._12_4_ = 0x7f800000;
            auVar138._16_4_ = 0x7f800000;
            auVar138._20_4_ = 0x7f800000;
            auVar138._24_4_ = 0x7f800000;
            auVar138._28_4_ = 0x7f800000;
            auVar86 = vblendmps_avx512vl(auVar138,_local_6c0);
            auVar118._0_4_ =
                 (uint)(bVar64 & 1) * auVar86._0_4_ | (uint)!(bool)(bVar64 & 1) * 0x7f800000;
            bVar69 = (bool)(bVar64 >> 1 & 1);
            auVar118._4_4_ = (uint)bVar69 * auVar86._4_4_ | (uint)!bVar69 * 0x7f800000;
            bVar69 = (bool)(bVar64 >> 2 & 1);
            auVar118._8_4_ = (uint)bVar69 * auVar86._8_4_ | (uint)!bVar69 * 0x7f800000;
            bVar69 = (bool)(bVar64 >> 3 & 1);
            auVar118._12_4_ = (uint)bVar69 * auVar86._12_4_ | (uint)!bVar69 * 0x7f800000;
            bVar69 = (bool)(bVar64 >> 4 & 1);
            auVar118._16_4_ = (uint)bVar69 * auVar86._16_4_ | (uint)!bVar69 * 0x7f800000;
            bVar69 = (bool)(bVar64 >> 5 & 1);
            auVar118._20_4_ = (uint)bVar69 * auVar86._20_4_ | (uint)!bVar69 * 0x7f800000;
            bVar69 = (bool)(bVar64 >> 6 & 1);
            auVar118._24_4_ = (uint)bVar69 * auVar86._24_4_ | (uint)!bVar69 * 0x7f800000;
            auVar118._28_4_ =
                 (uint)(bVar64 >> 7) * auVar86._28_4_ | (uint)!(bool)(bVar64 >> 7) * 0x7f800000;
            auVar86 = vshufps_avx(auVar118,auVar118,0xb1);
            auVar86 = vminps_avx(auVar118,auVar86);
            auVar84 = vshufpd_avx(auVar86,auVar86,5);
            auVar86 = vminps_avx(auVar86,auVar84);
            auVar84 = vpermpd_avx2(auVar86,0x4e);
            auVar86 = vminps_avx(auVar86,auVar84);
            uVar15 = vcmpps_avx512vl(auVar118,auVar86,0);
            bVar62 = (byte)uVar15 & bVar64;
            bVar63 = bVar64;
            if (bVar62 != 0) {
              bVar63 = bVar62;
            }
            iVar19 = 0;
            for (uVar72 = (uint)bVar63; (uVar72 & 1) == 0; uVar72 = uVar72 >> 1 | 0x80000000) {
              iVar19 = iVar19 + 1;
            }
            aVar1 = (ray->dir).field_0;
            local_600._0_16_ = (undefined1  [16])aVar1;
            auVar75 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
            if (auVar75._0_4_ < 0.0) {
              local_900[1] = 0;
              local_900[0] = bVar64;
              stack0xfffffffffffff702 = auVar87._2_30_;
              _local_720 = ZEXT416(*(uint *)(local_1a0 + (uint)(iVar19 << 2)));
              local_640._0_16_ = ZEXT416(*(uint *)(local_2c0 + (uint)(iVar19 << 2)));
              fVar152 = sqrtf(auVar75._0_4_);
              bVar64 = local_900[0];
              auVar75 = local_640._0_16_;
              auVar76 = _local_720;
            }
            else {
              auVar75 = vsqrtss_avx(auVar75,auVar75);
              fVar152 = auVar75._0_4_;
              auVar75 = ZEXT416(*(uint *)(local_2c0 + (uint)(iVar19 << 2)));
              auVar76 = ZEXT416(*(uint *)(local_1a0 + (uint)(iVar19 << 2)));
            }
            auVar75 = vinsertps_avx512f(auVar75,auVar76,0x10);
            bVar69 = true;
            uVar66 = 0;
            do {
              auVar76 = vbroadcastss_avx512vl(auVar75);
              auVar77 = vfmadd132ps_fma(auVar76,ZEXT816(0) << 0x40,local_600._0_16_);
              auVar76 = vmovshdup_avx512vl(auVar75);
              local_400._0_16_ = auVar76;
              fVar141 = 1.0 - auVar76._0_4_;
              auVar76 = vshufps_avx512vl(auVar75,auVar75,0x55);
              fVar142 = auVar76._0_4_;
              auVar164._0_4_ = local_4c0._0_4_ * fVar142;
              fVar128 = auVar76._4_4_;
              auVar164._4_4_ = local_4c0._4_4_ * fVar128;
              fVar153 = auVar76._8_4_;
              auVar164._8_4_ = local_4c0._8_4_ * fVar153;
              fVar155 = auVar76._12_4_;
              auVar164._12_4_ = local_4c0._12_4_ * fVar155;
              _local_3e0 = ZEXT416((uint)fVar141);
              auVar186._4_4_ = fVar141;
              auVar186._0_4_ = fVar141;
              auVar186._8_4_ = fVar141;
              auVar186._12_4_ = fVar141;
              auVar76 = vfmadd231ps_fma(auVar164,auVar186,local_480._0_16_);
              auVar199._0_4_ = local_4a0._0_4_ * fVar142;
              auVar199._4_4_ = local_4a0._4_4_ * fVar128;
              auVar199._8_4_ = local_4a0._8_4_ * fVar153;
              auVar199._12_4_ = local_4a0._12_4_ * fVar155;
              auVar78 = vfmadd231ps_fma(auVar199,auVar186,local_4c0._0_16_);
              auVar207._0_4_ = fVar142 * (float)local_4e0._0_4_;
              auVar207._4_4_ = fVar128 * (float)local_4e0._4_4_;
              auVar207._8_4_ = fVar153 * fStack_4d8;
              auVar207._12_4_ = fVar155 * fStack_4d4;
              auVar73 = vfmadd231ps_fma(auVar207,auVar186,local_4a0._0_16_);
              auVar214._0_4_ = fVar142 * auVar78._0_4_;
              auVar214._4_4_ = fVar128 * auVar78._4_4_;
              auVar214._8_4_ = fVar153 * auVar78._8_4_;
              auVar214._12_4_ = fVar155 * auVar78._12_4_;
              auVar76 = vfmadd231ps_fma(auVar214,auVar186,auVar76);
              auVar165._0_4_ = fVar142 * auVar73._0_4_;
              auVar165._4_4_ = fVar128 * auVar73._4_4_;
              auVar165._8_4_ = fVar153 * auVar73._8_4_;
              auVar165._12_4_ = fVar155 * auVar73._12_4_;
              auVar78 = vfmadd231ps_fma(auVar165,auVar186,auVar78);
              auVar200._0_4_ = fVar142 * auVar78._0_4_;
              auVar200._4_4_ = fVar128 * auVar78._4_4_;
              auVar200._8_4_ = fVar153 * auVar78._8_4_;
              auVar200._12_4_ = fVar155 * auVar78._12_4_;
              auVar73 = vfmadd231ps_fma(auVar200,auVar76,auVar186);
              auVar76 = vsubps_avx(auVar78,auVar76);
              auVar21._8_4_ = 0x40400000;
              auVar21._0_8_ = 0x4040000040400000;
              auVar21._12_4_ = 0x40400000;
              auVar76 = vmulps_avx512vl(auVar76,auVar21);
              _local_900 = auVar76;
              local_3c0._0_16_ = auVar73;
              auVar76 = vsubps_avx(auVar77,auVar73);
              _local_720 = auVar76;
              auVar76 = vdpps_avx(auVar76,auVar76,0x7f);
              local_640._0_16_ = auVar76;
              local_560._0_16_ = auVar75;
              if (auVar76._0_4_ < 0.0) {
                auVar228._0_4_ = sqrtf(auVar76._0_4_);
                auVar228._4_60_ = extraout_var;
                auVar75 = auVar228._0_16_;
              }
              else {
                auVar75 = vsqrtss_avx(auVar76,auVar76);
              }
              local_420._0_16_ = vdpps_avx(_local_900,_local_900,0x7f);
              fVar128 = local_420._0_4_;
              auVar166._4_12_ = ZEXT812(0) << 0x20;
              auVar166._0_4_ = fVar128;
              local_5a0._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar166);
              fVar142 = local_5a0._0_4_ * 1.5;
              local_440._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar166);
              auVar22._8_4_ = 0x80000000;
              auVar22._0_8_ = 0x8000000080000000;
              auVar22._12_4_ = 0x80000000;
              auVar77 = vxorps_avx512vl(local_420._0_16_,auVar22);
              auVar76 = vfnmadd213ss_fma(local_440._0_16_,local_420._0_16_,ZEXT416(0x40000000));
              local_460._0_4_ = auVar76._0_4_;
              local_580._0_4_ = auVar75._0_4_;
              if (fVar128 < auVar77._0_4_) {
                local_8c0._0_4_ = fVar142;
                local_8d0._0_4_ = fVar128 * -0.5;
                fVar153 = sqrtf(fVar128);
                auVar75 = ZEXT416((uint)local_580._0_4_);
                fVar142 = (float)local_8d0._0_4_;
              }
              else {
                auVar76 = vsqrtss_avx(local_420._0_16_,local_420._0_16_);
                fVar153 = auVar76._0_4_;
                local_8c0._0_4_ = fVar142;
                fVar142 = fVar128 * -0.5;
              }
              fVar128 = local_5a0._0_4_;
              fVar142 = (float)local_8c0._0_4_ + fVar142 * fVar128 * fVar128 * fVar128;
              local_8c0._0_4_ = fVar142 * (float)local_900._0_4_;
              local_8c0._4_4_ = fVar142 * (float)local_900._4_4_;
              local_8c0._8_4_ = fVar142 * fStack_8f8;
              local_8c0._12_4_ = fVar142 * fStack_8f4;
              local_5a0._0_16_ = vdpps_avx(local_8c0,_local_720,0x7f);
              auVar78 = vaddss_avx512f(auVar75,ZEXT416(0x3f800000));
              auVar131._0_4_ = local_5a0._0_4_ * local_5a0._0_4_;
              auVar131._4_4_ = local_5a0._4_4_ * local_5a0._4_4_;
              auVar131._8_4_ = local_5a0._8_4_ * local_5a0._8_4_;
              auVar131._12_4_ = local_5a0._12_4_ * local_5a0._12_4_;
              auVar76 = vsubps_avx(local_640._0_16_,auVar131);
              fVar128 = auVar76._0_4_;
              auVar143._4_12_ = ZEXT812(0) << 0x20;
              auVar143._0_4_ = fVar128;
              auVar77 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar143);
              auVar73 = vmulss_avx512f(auVar77,ZEXT416(0x3fc00000));
              in_ZMM31 = ZEXT1664(auVar73);
              local_8d0._0_4_ = fVar128 * -0.5;
              uVar70 = fVar128 == 0.0;
              uVar68 = fVar128 < 0.0;
              if ((bool)uVar68) {
                local_510._0_4_ = auVar73._0_4_;
                local_520 = fVar142;
                fStack_51c = fVar142;
                fStack_518 = fVar142;
                fStack_514 = fVar142;
                local_500 = auVar77;
                fVar154 = sqrtf(fVar128);
                in_ZMM31 = ZEXT464((uint)local_510._0_4_);
                auVar75 = ZEXT416((uint)local_580._0_4_);
                auVar78 = ZEXT416(auVar78._0_4_);
                auVar77 = local_500;
                fVar142 = local_520;
                fVar128 = fStack_51c;
                fVar155 = fStack_518;
                fVar141 = fStack_514;
              }
              else {
                auVar76 = vsqrtss_avx(auVar76,auVar76);
                fVar154 = auVar76._0_4_;
                fVar128 = fVar142;
                fVar155 = fVar142;
                fVar141 = fVar142;
              }
              auVar73 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),_local_3e0,local_400._0_16_);
              auVar76 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_400._0_16_,_local_3e0);
              fVar157 = auVar76._0_4_ * 6.0;
              fVar159 = local_400._0_4_ * 6.0;
              auVar187._0_4_ = fVar159 * (float)local_4e0._0_4_;
              auVar187._4_4_ = fVar159 * (float)local_4e0._4_4_;
              auVar187._8_4_ = fVar159 * fStack_4d8;
              auVar187._12_4_ = fVar159 * fStack_4d4;
              auVar167._4_4_ = fVar157;
              auVar167._0_4_ = fVar157;
              auVar167._8_4_ = fVar157;
              auVar167._12_4_ = fVar157;
              auVar76 = vfmadd132ps_fma(auVar167,auVar187,local_4a0._0_16_);
              fVar157 = auVar73._0_4_ * 6.0;
              auVar144._4_4_ = fVar157;
              auVar144._0_4_ = fVar157;
              auVar144._8_4_ = fVar157;
              auVar144._12_4_ = fVar157;
              auVar76 = vfmadd132ps_fma(auVar144,auVar76,local_4c0._0_16_);
              fVar157 = local_3e0._0_4_ * 6.0;
              auVar168._4_4_ = fVar157;
              auVar168._0_4_ = fVar157;
              auVar168._8_4_ = fVar157;
              auVar168._12_4_ = fVar157;
              auVar76 = vfmadd132ps_fma(auVar168,auVar76,local_480._0_16_);
              auVar145._0_4_ = auVar76._0_4_ * (float)local_420._0_4_;
              auVar145._4_4_ = auVar76._4_4_ * (float)local_420._0_4_;
              auVar145._8_4_ = auVar76._8_4_ * (float)local_420._0_4_;
              auVar145._12_4_ = auVar76._12_4_ * (float)local_420._0_4_;
              auVar76 = vdpps_avx(_local_900,auVar76,0x7f);
              fVar157 = auVar76._0_4_;
              auVar169._0_4_ = local_900._0_4_ * fVar157;
              auVar169._4_4_ = local_900._4_4_ * fVar157;
              auVar169._8_4_ = local_900._8_4_ * fVar157;
              auVar169._12_4_ = local_900._12_4_ * fVar157;
              auVar76 = vsubps_avx(auVar145,auVar169);
              fVar157 = (float)local_460._0_4_ * (float)local_440._0_4_;
              auVar73 = vmulss_avx512f(local_560._0_16_,ZEXT416((uint)(fVar152 * 1.9073486e-06)));
              auVar73 = vmaxss_avx(ZEXT416((uint)fVar185),auVar73);
              auVar23._8_4_ = 0x80000000;
              auVar23._0_8_ = 0x8000000080000000;
              auVar23._12_4_ = 0x80000000;
              auVar74 = vxorps_avx512vl(_local_900,auVar23);
              auVar170._0_4_ = fVar142 * auVar76._0_4_ * fVar157;
              auVar170._4_4_ = fVar128 * auVar76._4_4_ * fVar157;
              auVar170._8_4_ = fVar155 * auVar76._8_4_ * fVar157;
              auVar170._12_4_ = fVar141 * auVar76._12_4_ * fVar157;
              auVar76 = vdpps_avx(auVar74,local_8c0,0x7f);
              auVar79 = vfmadd213ss_fma(auVar75,ZEXT416((uint)fVar185),auVar73);
              auVar75 = vdpps_avx(_local_720,auVar170,0x7f);
              vfmadd213ss_avx512f(auVar78,ZEXT416((uint)(fVar185 / fVar153)),auVar79);
              fVar142 = auVar76._0_4_ + auVar75._0_4_;
              auVar75 = vdpps_avx(local_600._0_16_,local_8c0,0x7f);
              auVar76 = vdpps_avx(_local_720,auVar74,0x7f);
              auVar78 = vmulss_avx512f(auVar77,ZEXT416((uint)local_8d0._0_4_));
              auVar77 = vmulss_avx512f(auVar77,auVar77);
              auVar74 = vaddss_avx512f(in_ZMM31._0_16_,
                                       ZEXT416((uint)(auVar78._0_4_ * auVar77._0_4_)));
              auVar77 = vdpps_avx(_local_720,local_600._0_16_,0x7f);
              auVar79 = vfnmadd231ss_fma(auVar76,local_5a0._0_16_,ZEXT416((uint)fVar142));
              auVar77 = vfnmadd231ss_fma(auVar77,local_5a0._0_16_,auVar75);
              auVar76 = vpermilps_avx(local_3c0._0_16_,0xff);
              fVar154 = fVar154 - auVar76._0_4_;
              auVar78 = vshufps_avx(_local_900,_local_900,0xff);
              auVar76 = vfmsub213ss_fma(auVar79,auVar74,auVar78);
              auVar219._0_8_ = auVar76._0_8_ ^ 0x8000000080000000;
              auVar219._8_4_ = auVar76._8_4_ ^ 0x80000000;
              auVar219._12_4_ = auVar76._12_4_ ^ 0x80000000;
              auVar77 = ZEXT416((uint)(auVar77._0_4_ * auVar74._0_4_));
              auVar79 = vfmsub231ss_fma(ZEXT416((uint)(auVar75._0_4_ * auVar76._0_4_)),
                                        ZEXT416((uint)fVar142),auVar77);
              auVar76 = vinsertps_avx(auVar219,auVar77,0x1c);
              auVar208._0_8_ = auVar75._0_8_ ^ 0x8000000080000000;
              auVar208._8_4_ = auVar75._8_4_ ^ 0x80000000;
              auVar208._12_4_ = auVar75._12_4_ ^ 0x80000000;
              auVar77 = vinsertps_avx(ZEXT416((uint)fVar142),auVar208,0x10);
              auVar188._0_4_ = auVar79._0_4_;
              auVar188._4_4_ = auVar188._0_4_;
              auVar188._8_4_ = auVar188._0_4_;
              auVar188._12_4_ = auVar188._0_4_;
              auVar75 = vdivps_avx(auVar76,auVar188);
              auVar76 = vdivps_avx(auVar77,auVar188);
              fVar142 = local_5a0._0_4_;
              auVar189._0_4_ = fVar142 * auVar75._0_4_ + fVar154 * auVar76._0_4_;
              auVar189._4_4_ = fVar142 * auVar75._4_4_ + fVar154 * auVar76._4_4_;
              auVar189._8_4_ = fVar142 * auVar75._8_4_ + fVar154 * auVar76._8_4_;
              auVar189._12_4_ = fVar142 * auVar75._12_4_ + fVar154 * auVar76._12_4_;
              auVar75 = vsubps_avx512vl(local_560._0_16_,auVar189);
              auVar24._8_4_ = 0x7fffffff;
              auVar24._0_8_ = 0x7fffffff7fffffff;
              auVar24._12_4_ = 0x7fffffff;
              auVar76 = vandps_avx512vl(local_5a0._0_16_,auVar24);
              auVar76 = vucomiss_avx512f(auVar76);
              fVar142 = (float)local_960._0_4_;
              fVar128 = (float)local_960._4_4_;
              fVar153 = fStack_958;
              fVar155 = fStack_954;
              fVar141 = fStack_950;
              fVar157 = fStack_94c;
              fVar159 = fStack_948;
              fVar161 = fStack_944;
              if (!(bool)uVar68 && !(bool)uVar70) {
                auVar76 = vaddss_avx512f(auVar73,auVar76);
                auVar76 = vfmadd231ss_fma(auVar76,local_530,ZEXT416(0x36000000));
                auVar25._8_4_ = 0x7fffffff;
                auVar25._0_8_ = 0x7fffffff7fffffff;
                auVar25._12_4_ = 0x7fffffff;
                auVar77 = vandps_avx512vl(ZEXT416((uint)fVar154),auVar25);
                if (auVar77._0_4_ < auVar76._0_4_) {
                  auVar76 = vaddss_avx512f(auVar75,ZEXT416((uint)local_540._0_4_));
                  bVar63 = 0;
                  fVar152 = auVar76._0_4_;
                  bVar62 = 0;
                  if (fVar152 < (ray->org).field_0.m128[3]) goto LAB_01d43f79;
                  auVar218 = ZEXT3264(CONCAT428(0x3f800000,
                                                CONCAT424(0x3f800000,
                                                          CONCAT420(0x3f800000,
                                                                    CONCAT416(0x3f800000,
                                                                              CONCAT412(0x3f800000,
                                                                                        CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
                  if (fVar152 <= ray->tfar) {
                    auVar75 = vmovshdup_avx512vl(auVar75);
                    bVar63 = 0;
                    fVar154 = auVar75._0_4_;
                    if ((0.0 <= fVar154) && (bVar63 = 0, fVar154 <= 1.0)) {
                      auVar57._12_4_ = 0;
                      auVar57._0_12_ = ZEXT812(0);
                      auVar75 = vrsqrt14ss_avx512f(auVar57 << 0x20,ZEXT416((uint)local_640._0_4_));
                      fVar156 = auVar75._0_4_;
                      pGVar5 = (context->scene->geometries).items[local_928].ptr;
                      if ((pGVar5->mask & ray->mask) == 0) {
                        bVar63 = 0;
                      }
                      else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                              (bVar63 = 1, pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                        local_600._0_4_ = ray->tfar;
                        fVar142 = fVar156 * 1.5 +
                                  (float)local_640._0_4_ * -0.5 * fVar156 * fVar156 * fVar156;
                        auVar190._0_4_ = fVar142 * (float)local_720._0_4_;
                        auVar190._4_4_ = fVar142 * (float)local_720._4_4_;
                        auVar190._8_4_ = fVar142 * fStack_718;
                        auVar190._12_4_ = fVar142 * fStack_714;
                        auVar78 = vfmadd213ps_fma(auVar78,auVar190,_local_900);
                        auVar75 = vshufps_avx(auVar190,auVar190,0xc9);
                        auVar76 = vshufps_avx(_local_900,_local_900,0xc9);
                        auVar191._0_4_ = auVar190._0_4_ * auVar76._0_4_;
                        auVar191._4_4_ = auVar190._4_4_ * auVar76._4_4_;
                        auVar191._8_4_ = auVar190._8_4_ * auVar76._8_4_;
                        auVar191._12_4_ = auVar190._12_4_ * auVar76._12_4_;
                        auVar77 = vfmsub231ps_fma(auVar191,_local_900,auVar75);
                        auVar75 = vshufps_avx(auVar77,auVar77,0xc9);
                        auVar76 = vshufps_avx(auVar78,auVar78,0xc9);
                        auVar77 = vshufps_avx(auVar77,auVar77,0xd2);
                        auVar132._0_4_ = auVar78._0_4_ * auVar77._0_4_;
                        auVar132._4_4_ = auVar78._4_4_ * auVar77._4_4_;
                        auVar132._8_4_ = auVar78._8_4_ * auVar77._8_4_;
                        auVar132._12_4_ = auVar78._12_4_ * auVar77._12_4_;
                        auVar76 = vfmsub231ps_fma(auVar132,auVar75,auVar76);
                        auVar75 = vshufps_avx(auVar76,auVar76,0xe9);
                        local_5e0 = vmovlps_avx(auVar75);
                        local_5d8 = auVar76._0_4_;
                        local_5d4 = fVar154;
                        local_5d0 = 0;
                        local_5cc = (int)local_5a8;
                        local_5c8 = (int)local_928;
                        local_5c4 = context->user->instID[0];
                        local_5c0 = context->user->instPrimID[0];
                        ray->tfar = fVar152;
                        local_964 = -1;
                        local_6f0.valid = &local_964;
                        local_6f0.geometryUserPtr = pGVar5->userPtr;
                        local_6f0.context = context->user;
                        local_6f0.ray = (RTCRayN *)ray;
                        local_6f0.hit = (RTCHitN *)&local_5e0;
                        local_6f0.N = 1;
                        if ((pGVar5->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                           ((*pGVar5->occlusionFilterN)(&local_6f0), *local_6f0.valid != 0)) {
                          p_Var6 = context->args->filter;
                          if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                             ((((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                               (((pGVar5->field_8).field_0x2 & 0x40) != 0)) &&
                              ((*p_Var6)(&local_6f0), *local_6f0.valid == 0)))) goto LAB_01d4426f;
                          bVar63 = 1;
                        }
                        else {
LAB_01d4426f:
                          ray->tfar = (float)local_600._0_4_;
                          bVar63 = 0;
                        }
                        auVar218 = ZEXT3264(CONCAT428(0x3f800000,
                                                      CONCAT424(0x3f800000,
                                                                CONCAT420(0x3f800000,
                                                                          CONCAT416(0x3f800000,
                                                                                    CONCAT412(
                                                  0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)
                                                  ))))));
                        fVar142 = (float)local_960._0_4_;
                        fVar128 = (float)local_960._4_4_;
                        fVar153 = fStack_958;
                        fVar155 = fStack_954;
                        fVar141 = fStack_950;
                        fVar157 = fStack_94c;
                        fVar159 = fStack_948;
                        fVar161 = fStack_944;
                      }
                    }
                  }
                  goto LAB_01d43fd0;
                }
              }
              bVar69 = uVar66 < 4;
              uVar66 = uVar66 + 1;
            } while (uVar66 != 5);
            bVar69 = false;
            bVar62 = 5;
LAB_01d43f79:
            bVar63 = bVar62;
            auVar218 = ZEXT3264(CONCAT428(0x3f800000,
                                          CONCAT424(0x3f800000,
                                                    CONCAT420(0x3f800000,
                                                              CONCAT416(0x3f800000,
                                                                        CONCAT412(0x3f800000,
                                                                                  CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
LAB_01d43fd0:
            auVar244 = ZEXT3264(local_7c0);
            auVar243 = ZEXT3264(local_8a0);
            auVar242 = ZEXT3264(local_7e0);
            auVar241 = ZEXT3264(local_6a0);
            auVar240 = ZEXT3264(local_880);
            auVar239 = ZEXT3264(local_860);
            auVar238 = ZEXT3264(local_680);
            auVar237 = ZEXT3264(local_660);
            auVar236 = ZEXT3264(local_840);
            auVar235 = ZEXT3264(local_820);
            auVar234 = ZEXT3264(local_800);
            bVar67 = (bool)(bVar67 | bVar69 & bVar63);
            fVar152 = ray->tfar;
            auVar139._4_4_ = fVar152;
            auVar139._0_4_ = fVar152;
            auVar139._8_4_ = fVar152;
            auVar139._12_4_ = fVar152;
            auVar139._16_4_ = fVar152;
            auVar139._20_4_ = fVar152;
            auVar139._24_4_ = fVar152;
            auVar139._28_4_ = fVar152;
            auVar59._4_4_ = fStack_35c;
            auVar59._0_4_ = local_360;
            auVar59._8_4_ = fStack_358;
            auVar59._12_4_ = fStack_354;
            auVar59._16_4_ = fStack_350;
            auVar59._20_4_ = fStack_34c;
            auVar59._24_4_ = fStack_348;
            auVar59._28_4_ = fStack_344;
            uVar15 = vcmpps_avx512vl(auVar139,auVar59,0xd);
            bVar64 = ~('\x01' << ((byte)iVar19 & 0x1f)) & bVar64 & (byte)uVar15;
            auVar86 = local_280;
          } while (bVar64 != 0);
        }
        auVar224 = ZEXT3264(local_740);
        auVar231 = ZEXT3264(local_920);
        auVar228 = ZEXT3264(local_780);
        auVar226 = ZEXT3264(local_760);
        bVar64 = local_3a0[0] | (byte)local_8a8;
        auVar150._0_4_ = fVar142 + auVar86._0_4_;
        auVar150._4_4_ = fVar128 + auVar86._4_4_;
        auVar150._8_4_ = fVar153 + auVar86._8_4_;
        auVar150._12_4_ = fVar155 + auVar86._12_4_;
        auVar150._16_4_ = fVar141 + auVar86._16_4_;
        auVar150._20_4_ = fVar157 + auVar86._20_4_;
        auVar150._24_4_ = fVar159 + auVar86._24_4_;
        auVar150._28_4_ = fVar161 + auVar86._28_4_;
        uVar15 = vcmpps_avx512vl(auVar150,auVar139,2);
        bVar61 = (byte)uVar17 & bVar61 & (byte)uVar15;
        auVar151._8_4_ = 2;
        auVar151._0_8_ = 0x200000002;
        auVar151._12_4_ = 2;
        auVar151._16_4_ = 2;
        auVar151._20_4_ = 2;
        auVar151._24_4_ = 2;
        auVar151._28_4_ = 2;
        auVar40._8_4_ = 3;
        auVar40._0_8_ = 0x300000003;
        auVar40._12_4_ = 3;
        auVar40._16_4_ = 3;
        auVar40._20_4_ = 3;
        auVar40._24_4_ = 3;
        auVar40._28_4_ = 3;
        auVar86 = vpblendmd_avx512vl(auVar151,auVar40);
        auVar119._0_4_ = (uint)(bVar64 & 1) * auVar86._0_4_ | (uint)!(bool)(bVar64 & 1) * 2;
        bVar69 = (bool)(bVar64 >> 1 & 1);
        auVar119._4_4_ = (uint)bVar69 * auVar86._4_4_ | (uint)!bVar69 * 2;
        bVar69 = (bool)(bVar64 >> 2 & 1);
        auVar119._8_4_ = (uint)bVar69 * auVar86._8_4_ | (uint)!bVar69 * 2;
        bVar69 = (bool)(bVar64 >> 3 & 1);
        auVar119._12_4_ = (uint)bVar69 * auVar86._12_4_ | (uint)!bVar69 * 2;
        bVar69 = (bool)(bVar64 >> 4 & 1);
        auVar119._16_4_ = (uint)bVar69 * auVar86._16_4_ | (uint)!bVar69 * 2;
        bVar69 = (bool)(bVar64 >> 5 & 1);
        auVar119._20_4_ = (uint)bVar69 * auVar86._20_4_ | (uint)!bVar69 * 2;
        bVar69 = (bool)(bVar64 >> 6 & 1);
        auVar119._24_4_ = (uint)bVar69 * auVar86._24_4_ | (uint)!bVar69 * 2;
        auVar119._28_4_ = (uint)(bVar64 >> 7) * auVar86._28_4_ | (uint)!(bool)(bVar64 >> 7) * 2;
        uVar15 = vpcmpd_avx512vl(local_320,auVar119,5);
        bVar64 = (byte)uVar15 & bVar61;
        if (bVar64 != 0) {
          local_3a0 = auVar119;
          auVar76 = vminps_avx(local_480._0_16_,local_4c0._0_16_);
          auVar75 = vmaxps_avx(local_480._0_16_,local_4c0._0_16_);
          _local_6c0 = local_300;
          auVar77 = vminps_avx(local_4a0._0_16_,local_4e0._0_16_);
          auVar78 = vminps_avx(auVar76,auVar77);
          auVar76 = vmaxps_avx(local_4a0._0_16_,local_4e0._0_16_);
          auVar213 = ZEXT3264(local_300);
          auVar77 = vmaxps_avx(auVar75,auVar76);
          auVar171._8_4_ = 0x7fffffff;
          auVar171._0_8_ = 0x7fffffff7fffffff;
          auVar171._12_4_ = 0x7fffffff;
          auVar75 = vandps_avx(auVar78,auVar171);
          auVar76 = vandps_avx(auVar77,auVar171);
          auVar75 = vmaxps_avx(auVar75,auVar76);
          auVar76 = vmovshdup_avx(auVar75);
          auVar76 = vmaxss_avx(auVar76,auVar75);
          auVar75 = vshufpd_avx(auVar75,auVar75,1);
          auVar75 = vmaxss_avx(auVar75,auVar76);
          fVar185 = auVar75._0_4_ * 1.9073486e-06;
          local_530 = vshufps_avx(auVar77,auVar77,0xff);
          local_360 = fVar142 + local_300._0_4_;
          fStack_35c = fVar128 + local_300._4_4_;
          fStack_358 = fVar153 + local_300._8_4_;
          fStack_354 = fVar155 + local_300._12_4_;
          fStack_350 = fVar141 + local_300._16_4_;
          fStack_34c = fVar157 + local_300._20_4_;
          fStack_348 = fVar159 + local_300._24_4_;
          fStack_344 = fVar161 + local_300._28_4_;
          do {
            auVar87 = _local_900;
            auVar140._8_4_ = 0x7f800000;
            auVar140._0_8_ = 0x7f8000007f800000;
            auVar140._12_4_ = 0x7f800000;
            auVar140._16_4_ = 0x7f800000;
            auVar140._20_4_ = 0x7f800000;
            auVar140._24_4_ = 0x7f800000;
            auVar140._28_4_ = 0x7f800000;
            auVar86 = vblendmps_avx512vl(auVar140,auVar213._0_32_);
            auVar120._0_4_ =
                 (uint)(bVar64 & 1) * auVar86._0_4_ | (uint)!(bool)(bVar64 & 1) * 0x7f800000;
            bVar69 = (bool)(bVar64 >> 1 & 1);
            auVar120._4_4_ = (uint)bVar69 * auVar86._4_4_ | (uint)!bVar69 * 0x7f800000;
            bVar69 = (bool)(bVar64 >> 2 & 1);
            auVar120._8_4_ = (uint)bVar69 * auVar86._8_4_ | (uint)!bVar69 * 0x7f800000;
            bVar69 = (bool)(bVar64 >> 3 & 1);
            auVar120._12_4_ = (uint)bVar69 * auVar86._12_4_ | (uint)!bVar69 * 0x7f800000;
            bVar69 = (bool)(bVar64 >> 4 & 1);
            auVar120._16_4_ = (uint)bVar69 * auVar86._16_4_ | (uint)!bVar69 * 0x7f800000;
            bVar69 = (bool)(bVar64 >> 5 & 1);
            auVar120._20_4_ = (uint)bVar69 * auVar86._20_4_ | (uint)!bVar69 * 0x7f800000;
            bVar69 = (bool)(bVar64 >> 6 & 1);
            auVar120._24_4_ = (uint)bVar69 * auVar86._24_4_ | (uint)!bVar69 * 0x7f800000;
            auVar120._28_4_ =
                 (uint)(bVar64 >> 7) * auVar86._28_4_ | (uint)!(bool)(bVar64 >> 7) * 0x7f800000;
            auVar86 = vshufps_avx(auVar120,auVar120,0xb1);
            auVar86 = vminps_avx(auVar120,auVar86);
            auVar84 = vshufpd_avx(auVar86,auVar86,5);
            auVar86 = vminps_avx(auVar86,auVar84);
            auVar84 = vpermpd_avx2(auVar86,0x4e);
            auVar86 = vminps_avx(auVar86,auVar84);
            uVar15 = vcmpps_avx512vl(auVar120,auVar86,0);
            bVar62 = (byte)uVar15 & bVar64;
            bVar63 = bVar64;
            if (bVar62 != 0) {
              bVar63 = bVar62;
            }
            iVar19 = 0;
            for (uVar72 = (uint)bVar63; (uVar72 & 1) == 0; uVar72 = uVar72 >> 1 | 0x80000000) {
              iVar19 = iVar19 + 1;
            }
            aVar1 = (ray->dir).field_0;
            local_600._0_16_ = (undefined1  [16])aVar1;
            auVar75 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
            if (auVar75._0_4_ < 0.0) {
              local_900[1] = 0;
              local_900[0] = bVar64;
              stack0xfffffffffffff702 = auVar87._2_30_;
              _local_720 = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar19 << 2)));
              local_640._0_16_ = ZEXT416(*(uint *)(local_2e0 + (uint)(iVar19 << 2)));
              fVar142 = sqrtf(auVar75._0_4_);
              bVar64 = local_900[0];
              auVar75 = local_640._0_16_;
              auVar76 = _local_720;
            }
            else {
              auVar75 = vsqrtss_avx(auVar75,auVar75);
              fVar142 = auVar75._0_4_;
              auVar75 = ZEXT416(*(uint *)(local_2e0 + (uint)(iVar19 << 2)));
              auVar76 = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar19 << 2)));
            }
            auVar75 = vinsertps_avx512f(auVar75,auVar76,0x10);
            bVar69 = true;
            uVar66 = 0;
            do {
              auVar76 = vbroadcastss_avx512vl(auVar75);
              auVar77 = vfmadd132ps_fma(auVar76,ZEXT816(0) << 0x40,local_600._0_16_);
              auVar76 = vmovshdup_avx512vl(auVar75);
              local_400._0_16_ = auVar76;
              fVar157 = 1.0 - auVar76._0_4_;
              auVar76 = vshufps_avx512vl(auVar75,auVar75,0x55);
              fVar128 = auVar76._0_4_;
              auVar172._0_4_ = local_4c0._0_4_ * fVar128;
              fVar153 = auVar76._4_4_;
              auVar172._4_4_ = local_4c0._4_4_ * fVar153;
              fVar155 = auVar76._8_4_;
              auVar172._8_4_ = local_4c0._8_4_ * fVar155;
              fVar141 = auVar76._12_4_;
              auVar172._12_4_ = local_4c0._12_4_ * fVar141;
              _local_3e0 = ZEXT416((uint)fVar157);
              auVar192._4_4_ = fVar157;
              auVar192._0_4_ = fVar157;
              auVar192._8_4_ = fVar157;
              auVar192._12_4_ = fVar157;
              auVar76 = vfmadd231ps_fma(auVar172,auVar192,local_480._0_16_);
              auVar201._0_4_ = local_4a0._0_4_ * fVar128;
              auVar201._4_4_ = local_4a0._4_4_ * fVar153;
              auVar201._8_4_ = local_4a0._8_4_ * fVar155;
              auVar201._12_4_ = local_4a0._12_4_ * fVar141;
              auVar78 = vfmadd231ps_fma(auVar201,auVar192,local_4c0._0_16_);
              auVar209._0_4_ = fVar128 * (float)local_4e0._0_4_;
              auVar209._4_4_ = fVar153 * (float)local_4e0._4_4_;
              auVar209._8_4_ = fVar155 * fStack_4d8;
              auVar209._12_4_ = fVar141 * fStack_4d4;
              auVar73 = vfmadd231ps_fma(auVar209,auVar192,local_4a0._0_16_);
              auVar215._0_4_ = fVar128 * auVar78._0_4_;
              auVar215._4_4_ = fVar153 * auVar78._4_4_;
              auVar215._8_4_ = fVar155 * auVar78._8_4_;
              auVar215._12_4_ = fVar141 * auVar78._12_4_;
              auVar76 = vfmadd231ps_fma(auVar215,auVar192,auVar76);
              auVar173._0_4_ = fVar128 * auVar73._0_4_;
              auVar173._4_4_ = fVar153 * auVar73._4_4_;
              auVar173._8_4_ = fVar155 * auVar73._8_4_;
              auVar173._12_4_ = fVar141 * auVar73._12_4_;
              auVar78 = vfmadd231ps_fma(auVar173,auVar192,auVar78);
              auVar202._0_4_ = fVar128 * auVar78._0_4_;
              auVar202._4_4_ = fVar153 * auVar78._4_4_;
              auVar202._8_4_ = fVar155 * auVar78._8_4_;
              auVar202._12_4_ = fVar141 * auVar78._12_4_;
              auVar73 = vfmadd231ps_fma(auVar202,auVar76,auVar192);
              auVar76 = vsubps_avx(auVar78,auVar76);
              auVar26._8_4_ = 0x40400000;
              auVar26._0_8_ = 0x4040000040400000;
              auVar26._12_4_ = 0x40400000;
              auVar76 = vmulps_avx512vl(auVar76,auVar26);
              _local_900 = auVar76;
              local_3c0._0_16_ = auVar73;
              auVar76 = vsubps_avx(auVar77,auVar73);
              _local_720 = auVar76;
              auVar76 = vdpps_avx(auVar76,auVar76,0x7f);
              local_640._0_16_ = auVar76;
              local_560._0_16_ = auVar75;
              if (auVar76._0_4_ < 0.0) {
                auVar231._0_4_ = sqrtf(auVar76._0_4_);
                auVar231._4_60_ = extraout_var_00;
                auVar75 = auVar231._0_16_;
              }
              else {
                auVar75 = vsqrtss_avx(auVar76,auVar76);
              }
              local_420._0_16_ = vdpps_avx(_local_900,_local_900,0x7f);
              fVar153 = local_420._0_4_;
              auVar174._4_12_ = ZEXT812(0) << 0x20;
              auVar174._0_4_ = fVar153;
              local_5a0._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar174);
              fVar128 = local_5a0._0_4_ * 1.5;
              local_440._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar174);
              auVar27._8_4_ = 0x80000000;
              auVar27._0_8_ = 0x8000000080000000;
              auVar27._12_4_ = 0x80000000;
              auVar77 = vxorps_avx512vl(local_420._0_16_,auVar27);
              auVar76 = vfnmadd213ss_fma(local_440._0_16_,local_420._0_16_,ZEXT416(0x40000000));
              local_460._0_4_ = auVar76._0_4_;
              local_580._0_4_ = auVar75._0_4_;
              if (fVar153 < auVar77._0_4_) {
                local_8c0._0_4_ = fVar128;
                local_8d0._0_4_ = fVar153 * -0.5;
                auVar234._0_4_ = sqrtf(fVar153);
                auVar234._4_60_ = extraout_var_01;
                auVar75 = ZEXT416((uint)local_580._0_4_);
                auVar76 = auVar234._0_16_;
                fVar128 = (float)local_8c0._0_4_;
              }
              else {
                auVar76 = vsqrtss_avx512f(local_420._0_16_,local_420._0_16_);
                local_8d0._0_4_ = fVar153 * -0.5;
              }
              fVar153 = local_5a0._0_4_;
              fVar128 = fVar128 + (float)local_8d0._0_4_ * fVar153 * fVar153 * fVar153;
              local_8d0._0_4_ = fVar128 * (float)local_900._0_4_;
              local_8d0._4_4_ = fVar128 * (float)local_900._4_4_;
              local_8d0._8_4_ = fVar128 * fStack_8f8;
              local_8d0._12_4_ = fVar128 * fStack_8f4;
              local_5a0._0_16_ = vdpps_avx(_local_720,local_8d0,0x7f);
              auVar73 = vaddss_avx512f(auVar75,ZEXT416(0x3f800000));
              auVar133._0_4_ = local_5a0._0_4_ * local_5a0._0_4_;
              auVar133._4_4_ = local_5a0._4_4_ * local_5a0._4_4_;
              auVar133._8_4_ = local_5a0._8_4_ * local_5a0._8_4_;
              auVar133._12_4_ = local_5a0._12_4_ * local_5a0._12_4_;
              auVar77 = vsubps_avx(local_640._0_16_,auVar133);
              fVar153 = auVar77._0_4_;
              auVar146._4_12_ = ZEXT812(0) << 0x20;
              auVar146._0_4_ = fVar153;
              auVar78 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar146);
              auVar79 = vmulss_avx512f(auVar78,ZEXT416(0x3fc00000));
              local_8c0._0_4_ = auVar79._0_4_;
              uVar70 = fVar153 == 0.0;
              uVar68 = fVar153 < 0.0;
              if ((bool)uVar68) {
                local_500._0_4_ = auVar76._0_4_;
                local_520 = fVar128;
                fStack_51c = fVar128;
                fStack_518 = fVar128;
                fStack_514 = fVar128;
                local_510 = auVar78;
                fVar155 = sqrtf(fVar153);
                auVar76 = ZEXT416((uint)local_500._0_4_);
                auVar75 = ZEXT416((uint)local_580._0_4_);
                auVar73 = ZEXT416(auVar73._0_4_);
                auVar78 = local_510;
                fVar128 = local_520;
                fVar141 = fStack_51c;
                fVar157 = fStack_518;
                fVar159 = fStack_514;
              }
              else {
                auVar77 = vsqrtss_avx(auVar77,auVar77);
                fVar155 = auVar77._0_4_;
                fVar141 = fVar128;
                fVar157 = fVar128;
                fVar159 = fVar128;
              }
              in_ZMM31 = ZEXT1664(auVar78);
              auVar226 = ZEXT3264(local_760);
              auVar228 = ZEXT3264(local_780);
              auVar231 = ZEXT3264(local_920);
              auVar244 = ZEXT3264(local_7c0);
              auVar242 = ZEXT3264(local_7e0);
              auVar234 = ZEXT3264(local_800);
              auVar235 = ZEXT3264(local_820);
              auVar236 = ZEXT3264(local_840);
              auVar237 = ZEXT3264(local_660);
              auVar238 = ZEXT3264(local_680);
              auVar239 = ZEXT3264(local_860);
              auVar240 = ZEXT3264(local_880);
              auVar241 = ZEXT3264(local_6a0);
              auVar243 = ZEXT3264(local_8a0);
              auVar79 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),_local_3e0,local_400._0_16_);
              auVar77 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_400._0_16_,_local_3e0);
              fVar161 = auVar77._0_4_ * 6.0;
              fVar152 = local_400._0_4_ * 6.0;
              auVar193._0_4_ = fVar152 * (float)local_4e0._0_4_;
              auVar193._4_4_ = fVar152 * (float)local_4e0._4_4_;
              auVar193._8_4_ = fVar152 * fStack_4d8;
              auVar193._12_4_ = fVar152 * fStack_4d4;
              auVar175._4_4_ = fVar161;
              auVar175._0_4_ = fVar161;
              auVar175._8_4_ = fVar161;
              auVar175._12_4_ = fVar161;
              auVar77 = vfmadd132ps_fma(auVar175,auVar193,local_4a0._0_16_);
              fVar161 = auVar79._0_4_ * 6.0;
              auVar147._4_4_ = fVar161;
              auVar147._0_4_ = fVar161;
              auVar147._8_4_ = fVar161;
              auVar147._12_4_ = fVar161;
              auVar77 = vfmadd132ps_fma(auVar147,auVar77,local_4c0._0_16_);
              fVar161 = local_3e0._0_4_ * 6.0;
              auVar176._4_4_ = fVar161;
              auVar176._0_4_ = fVar161;
              auVar176._8_4_ = fVar161;
              auVar176._12_4_ = fVar161;
              auVar77 = vfmadd132ps_fma(auVar176,auVar77,local_480._0_16_);
              auVar148._0_4_ = auVar77._0_4_ * (float)local_420._0_4_;
              auVar148._4_4_ = auVar77._4_4_ * (float)local_420._0_4_;
              auVar148._8_4_ = auVar77._8_4_ * (float)local_420._0_4_;
              auVar148._12_4_ = auVar77._12_4_ * (float)local_420._0_4_;
              auVar77 = vdpps_avx(_local_900,auVar77,0x7f);
              fVar161 = auVar77._0_4_;
              auVar177._0_4_ = local_900._0_4_ * fVar161;
              auVar177._4_4_ = local_900._4_4_ * fVar161;
              auVar177._8_4_ = local_900._8_4_ * fVar161;
              auVar177._12_4_ = local_900._12_4_ * fVar161;
              auVar77 = vsubps_avx(auVar148,auVar177);
              fVar161 = (float)local_460._0_4_ * (float)local_440._0_4_;
              auVar79 = vmulss_avx512f(local_560._0_16_,ZEXT416((uint)(fVar142 * 1.9073486e-06)));
              auVar79 = vmaxss_avx(ZEXT416((uint)fVar185),auVar79);
              auVar28._8_4_ = 0x80000000;
              auVar28._0_8_ = 0x8000000080000000;
              auVar28._12_4_ = 0x80000000;
              auVar74 = vxorps_avx512vl(_local_900,auVar28);
              auVar178._0_4_ = fVar128 * auVar77._0_4_ * fVar161;
              auVar178._4_4_ = fVar141 * auVar77._4_4_ * fVar161;
              auVar178._8_4_ = fVar157 * auVar77._8_4_ * fVar161;
              auVar178._12_4_ = fVar159 * auVar77._12_4_ * fVar161;
              auVar77 = vdpps_avx(auVar74,local_8d0,0x7f);
              auVar80 = vdivss_avx512f(ZEXT416((uint)fVar185),auVar76);
              auVar76 = vfmadd213ss_fma(auVar75,ZEXT416((uint)fVar185),auVar79);
              auVar75 = vdpps_avx(_local_720,auVar178,0x7f);
              vfmadd213ss_avx512f(auVar73,auVar80,auVar76);
              fVar128 = auVar77._0_4_ + auVar75._0_4_;
              auVar75 = vdpps_avx(local_600._0_16_,local_8d0,0x7f);
              auVar76 = vdpps_avx(_local_720,auVar74,0x7f);
              auVar77 = vmulss_avx512f(auVar78,ZEXT416((uint)(fVar153 * -0.5)));
              auVar78 = vmulss_avx512f(auVar78,auVar78);
              fVar153 = auVar77._0_4_ * auVar78._0_4_ + (float)local_8c0._0_4_;
              auVar77 = vdpps_avx(_local_720,local_600._0_16_,0x7f);
              auVar73 = vfnmadd231ss_avx512f(auVar76,local_5a0._0_16_,ZEXT416((uint)fVar128));
              auVar77 = vfnmadd231ss_avx512f(auVar77,local_5a0._0_16_,auVar75);
              auVar76 = vpermilps_avx(local_3c0._0_16_,0xff);
              fVar155 = fVar155 - auVar76._0_4_;
              auVar78 = vshufps_avx(_local_900,_local_900,0xff);
              auVar76 = vfmsub213ss_fma(auVar73,ZEXT416((uint)fVar153),auVar78);
              auVar220._0_8_ = auVar76._0_8_ ^ 0x8000000080000000;
              auVar220._8_4_ = auVar76._8_4_ ^ 0x80000000;
              auVar220._12_4_ = auVar76._12_4_ ^ 0x80000000;
              auVar77 = ZEXT416((uint)(auVar77._0_4_ * fVar153));
              auVar73 = vfmsub231ss_fma(ZEXT416((uint)(auVar75._0_4_ * auVar76._0_4_)),
                                        ZEXT416((uint)fVar128),auVar77);
              auVar76 = vinsertps_avx(auVar220,auVar77,0x1c);
              auVar210._0_8_ = auVar75._0_8_ ^ 0x8000000080000000;
              auVar210._8_4_ = auVar75._8_4_ ^ 0x80000000;
              auVar210._12_4_ = auVar75._12_4_ ^ 0x80000000;
              auVar77 = vinsertps_avx(ZEXT416((uint)fVar128),auVar210,0x10);
              auVar194._0_4_ = auVar73._0_4_;
              auVar194._4_4_ = auVar194._0_4_;
              auVar194._8_4_ = auVar194._0_4_;
              auVar194._12_4_ = auVar194._0_4_;
              auVar75 = vdivps_avx(auVar76,auVar194);
              auVar76 = vdivps_avx(auVar77,auVar194);
              auVar77 = vbroadcastss_avx512vl(local_5a0._0_16_);
              auVar195._0_4_ = auVar77._0_4_ * auVar75._0_4_ + fVar155 * auVar76._0_4_;
              auVar195._4_4_ = auVar77._4_4_ * auVar75._4_4_ + fVar155 * auVar76._4_4_;
              auVar195._8_4_ = auVar77._8_4_ * auVar75._8_4_ + fVar155 * auVar76._8_4_;
              auVar195._12_4_ = auVar77._12_4_ * auVar75._12_4_ + fVar155 * auVar76._12_4_;
              auVar75 = vsubps_avx512vl(local_560._0_16_,auVar195);
              auVar29._8_4_ = 0x7fffffff;
              auVar29._0_8_ = 0x7fffffff7fffffff;
              auVar29._12_4_ = 0x7fffffff;
              auVar76 = vandps_avx512vl(local_5a0._0_16_,auVar29);
              auVar76 = vucomiss_avx512f(auVar76);
              if (!(bool)uVar68 && !(bool)uVar70) {
                auVar76 = vaddss_avx512f(auVar79,auVar76);
                auVar76 = vfmadd231ss_fma(auVar76,local_530,ZEXT416(0x36000000));
                auVar30._8_4_ = 0x7fffffff;
                auVar30._0_8_ = 0x7fffffff7fffffff;
                auVar30._12_4_ = 0x7fffffff;
                auVar77 = vandps_avx512vl(ZEXT416((uint)fVar155),auVar30);
                if (auVar77._0_4_ < auVar76._0_4_) {
                  auVar76 = vaddss_avx512f(auVar75,ZEXT416((uint)local_540._0_4_));
                  bVar62 = 0;
                  fVar152 = auVar76._0_4_;
                  auVar224 = ZEXT3264(local_740);
                  bVar63 = 0;
                  if (fVar152 < (ray->org).field_0.m128[3]) goto LAB_01d44b06;
                  auVar218 = ZEXT3264(CONCAT428(0x3f800000,
                                                CONCAT424(0x3f800000,
                                                          CONCAT420(0x3f800000,
                                                                    CONCAT416(0x3f800000,
                                                                              CONCAT412(0x3f800000,
                                                                                        CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
                  auVar213 = ZEXT3264(_local_6c0);
                  fVar142 = (float)local_960._0_4_;
                  fVar128 = (float)local_960._4_4_;
                  fVar153 = fStack_958;
                  fVar155 = fStack_954;
                  fVar141 = fStack_950;
                  fVar157 = fStack_94c;
                  fVar159 = fStack_948;
                  fVar161 = fStack_944;
                  if (ray->tfar < fVar152) goto LAB_01d44b1e;
                  auVar75 = vmovshdup_avx512vl(auVar75);
                  bVar62 = 0;
                  fVar154 = auVar75._0_4_;
                  if ((fVar154 < 0.0) || (1.0 < fVar154)) goto LAB_01d44b1e;
                  auVar58._12_4_ = 0;
                  auVar58._0_12_ = ZEXT812(0);
                  auVar75 = vrsqrt14ss_avx512f(auVar58 << 0x20,ZEXT416((uint)local_640._0_4_));
                  fVar142 = auVar75._0_4_;
                  pGVar5 = (context->scene->geometries).items[local_928].ptr;
                  if ((pGVar5->mask & ray->mask) == 0) {
                    bVar62 = 0;
                  }
                  else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                          (bVar62 = 1, pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    local_600._0_4_ = ray->tfar;
                    fVar142 = fVar142 * 1.5 +
                              (float)local_640._0_4_ * -0.5 * fVar142 * fVar142 * fVar142;
                    auVar196._0_4_ = local_720._0_4_ * fVar142;
                    auVar196._4_4_ = local_720._4_4_ * fVar142;
                    auVar196._8_4_ = local_720._8_4_ * fVar142;
                    auVar196._12_4_ = local_720._12_4_ * fVar142;
                    auVar78 = vfmadd213ps_fma(auVar78,auVar196,_local_900);
                    auVar75 = vshufps_avx(auVar196,auVar196,0xc9);
                    auVar76 = vshufps_avx(_local_900,_local_900,0xc9);
                    auVar197._0_4_ = auVar196._0_4_ * auVar76._0_4_;
                    auVar197._4_4_ = auVar196._4_4_ * auVar76._4_4_;
                    auVar197._8_4_ = auVar196._8_4_ * auVar76._8_4_;
                    auVar197._12_4_ = auVar196._12_4_ * auVar76._12_4_;
                    auVar77 = vfmsub231ps_fma(auVar197,_local_900,auVar75);
                    auVar75 = vshufps_avx(auVar77,auVar77,0xc9);
                    auVar76 = vshufps_avx(auVar78,auVar78,0xc9);
                    auVar77 = vshufps_avx(auVar77,auVar77,0xd2);
                    auVar134._0_4_ = auVar78._0_4_ * auVar77._0_4_;
                    auVar134._4_4_ = auVar78._4_4_ * auVar77._4_4_;
                    auVar134._8_4_ = auVar78._8_4_ * auVar77._8_4_;
                    auVar134._12_4_ = auVar78._12_4_ * auVar77._12_4_;
                    auVar76 = vfmsub231ps_fma(auVar134,auVar75,auVar76);
                    auVar75 = vshufps_avx(auVar76,auVar76,0xe9);
                    local_5e0 = vmovlps_avx(auVar75);
                    local_5d8 = auVar76._0_4_;
                    local_5d4 = fVar154;
                    local_5d0 = 0;
                    local_5cc = (int)local_5a8;
                    local_5c8 = (int)local_928;
                    local_5c4 = context->user->instID[0];
                    local_5c0 = context->user->instPrimID[0];
                    ray->tfar = fVar152;
                    local_964 = -1;
                    local_6f0.valid = &local_964;
                    local_6f0.geometryUserPtr = pGVar5->userPtr;
                    local_6f0.context = context->user;
                    local_6f0.ray = (RTCRayN *)ray;
                    local_6f0.hit = (RTCHitN *)&local_5e0;
                    local_6f0.N = 1;
                    if ((pGVar5->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                       ((*pGVar5->occlusionFilterN)(&local_6f0), *local_6f0.valid != 0)) {
                      p_Var6 = context->args->filter;
                      if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                         ((((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                            RTC_RAY_QUERY_FLAG_INCOHERENT ||
                           (((pGVar5->field_8).field_0x2 & 0x40) != 0)) &&
                          ((*p_Var6)(&local_6f0), *local_6f0.valid == 0)))) goto LAB_01d44d9b;
                      bVar62 = 1;
                    }
                    else {
LAB_01d44d9b:
                      ray->tfar = (float)local_600._0_4_;
                      bVar62 = 0;
                    }
                    auVar218 = ZEXT3264(CONCAT428(0x3f800000,
                                                  CONCAT424(0x3f800000,
                                                            CONCAT420(0x3f800000,
                                                                      CONCAT416(0x3f800000,
                                                                                CONCAT412(0x3f800000
                                                                                          ,CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
                    auVar226 = ZEXT3264(local_760);
                    auVar228 = ZEXT3264(local_780);
                    auVar231 = ZEXT3264(local_920);
                    auVar244 = ZEXT3264(local_7c0);
                    auVar242 = ZEXT3264(local_7e0);
                    auVar234 = ZEXT3264(local_800);
                    auVar235 = ZEXT3264(local_820);
                    auVar236 = ZEXT3264(local_840);
                    auVar237 = ZEXT3264(local_660);
                    auVar238 = ZEXT3264(local_680);
                    auVar239 = ZEXT3264(local_860);
                    auVar240 = ZEXT3264(local_880);
                    auVar241 = ZEXT3264(local_6a0);
                    auVar243 = ZEXT3264(local_8a0);
                  }
                  goto LAB_01d44b15;
                }
              }
              bVar69 = uVar66 < 4;
              uVar66 = uVar66 + 1;
            } while (uVar66 != 5);
            bVar69 = false;
            bVar63 = 5;
LAB_01d44b06:
            bVar62 = bVar63;
            auVar218 = ZEXT3264(CONCAT428(0x3f800000,
                                          CONCAT424(0x3f800000,
                                                    CONCAT420(0x3f800000,
                                                              CONCAT416(0x3f800000,
                                                                        CONCAT412(0x3f800000,
                                                                                  CONCAT48(
                                                  0x3f800000,0x3f8000003f800000)))))));
LAB_01d44b15:
            auVar224 = ZEXT3264(local_740);
            auVar213 = ZEXT3264(_local_6c0);
            fVar142 = (float)local_960._0_4_;
            fVar128 = (float)local_960._4_4_;
            fVar153 = fStack_958;
            fVar155 = fStack_954;
            fVar141 = fStack_950;
            fVar157 = fStack_94c;
            fVar159 = fStack_948;
            fVar161 = fStack_944;
LAB_01d44b1e:
            bVar67 = (bool)(bVar67 | bVar69 & bVar62);
            fVar152 = ray->tfar;
            auVar139._4_4_ = fVar152;
            auVar139._0_4_ = fVar152;
            auVar139._8_4_ = fVar152;
            auVar139._12_4_ = fVar152;
            auVar139._16_4_ = fVar152;
            auVar139._20_4_ = fVar152;
            auVar139._24_4_ = fVar152;
            auVar139._28_4_ = fVar152;
            auVar60._4_4_ = fStack_35c;
            auVar60._0_4_ = local_360;
            auVar60._8_4_ = fStack_358;
            auVar60._12_4_ = fStack_354;
            auVar60._16_4_ = fStack_350;
            auVar60._20_4_ = fStack_34c;
            auVar60._24_4_ = fStack_348;
            auVar60._28_4_ = fStack_344;
            uVar15 = vcmpps_avx512vl(auVar139,auVar60,0xd);
            bVar64 = ~('\x01' << ((byte)iVar19 & 0x1f)) & bVar64 & (byte)uVar15;
            auVar119 = local_3a0;
          } while (bVar64 != 0);
        }
        uVar17 = vpcmpgtd_avx512vl(auVar119,local_320);
        uVar18 = vpcmpd_avx512vl(local_320,local_260,1);
        auVar183._0_4_ = fVar142 + (float)local_2c0._0_4_;
        auVar183._4_4_ = fVar128 + (float)local_2c0._4_4_;
        auVar183._8_4_ = fVar153 + fStack_2b8;
        auVar183._12_4_ = fVar155 + fStack_2b4;
        auVar183._16_4_ = fVar141 + fStack_2b0;
        auVar183._20_4_ = fVar157 + fStack_2ac;
        auVar183._24_4_ = fVar159 + fStack_2a8;
        auVar183._28_4_ = fVar161 + fStack_2a4;
        uVar15 = vcmpps_avx512vl(auVar183,auVar139,2);
        bVar64 = (byte)local_8a4 & (byte)uVar18 & (byte)uVar15;
        auVar184._0_4_ = fVar142 + local_300._0_4_;
        auVar184._4_4_ = fVar128 + local_300._4_4_;
        auVar184._8_4_ = fVar153 + local_300._8_4_;
        auVar184._12_4_ = fVar155 + local_300._12_4_;
        auVar184._16_4_ = fVar141 + local_300._16_4_;
        auVar184._20_4_ = fVar157 + local_300._20_4_;
        auVar184._24_4_ = fVar159 + local_300._24_4_;
        auVar184._28_4_ = fVar161 + local_300._28_4_;
        uVar15 = vcmpps_avx512vl(auVar184,auVar139,2);
        bVar61 = bVar61 & (byte)uVar17 & (byte)uVar15 | bVar64;
        prim = local_4f0;
        if (bVar61 != 0) {
          abStack_180[uVar65 * 0x60] = bVar61;
          bVar69 = (bool)(bVar64 >> 1 & 1);
          bVar7 = (bool)(bVar64 >> 2 & 1);
          bVar8 = (bool)(bVar64 >> 3 & 1);
          bVar9 = (bool)(bVar64 >> 4 & 1);
          bVar10 = (bool)(bVar64 >> 5 & 1);
          bVar11 = (bool)(bVar64 >> 6 & 1);
          auStack_160[uVar65 * 0x18] =
               (uint)(bVar64 & 1) * local_2c0._0_4_ |
               (uint)!(bool)(bVar64 & 1) * (int)local_300._0_4_;
          auStack_160[uVar65 * 0x18 + 1] =
               (uint)bVar69 * local_2c0._4_4_ | (uint)!bVar69 * (int)local_300._4_4_;
          auStack_160[uVar65 * 0x18 + 2] =
               (uint)bVar7 * (int)fStack_2b8 | (uint)!bVar7 * (int)local_300._8_4_;
          auStack_160[uVar65 * 0x18 + 3] =
               (uint)bVar8 * (int)fStack_2b4 | (uint)!bVar8 * (int)local_300._12_4_;
          auStack_160[uVar65 * 0x18 + 4] =
               (uint)bVar9 * (int)fStack_2b0 | (uint)!bVar9 * (int)local_300._16_4_;
          auStack_160[uVar65 * 0x18 + 5] =
               (uint)bVar10 * (int)fStack_2ac | (uint)!bVar10 * (int)local_300._20_4_;
          auStack_160[uVar65 * 0x18 + 6] =
               (uint)bVar11 * (int)fStack_2a8 | (uint)!bVar11 * (int)local_300._24_4_;
          auStack_160[uVar65 * 0x18 + 7] =
               (uint)(bVar64 >> 7) * (int)fStack_2a4 |
               (uint)!(bool)(bVar64 >> 7) * (int)local_300._28_4_;
          uVar66 = vmovlps_avx(local_330);
          (&uStack_140)[uVar65 * 0xc] = uVar66;
          aiStack_138[uVar65 * 0x18] = local_978 + 1;
          uVar65 = (ulong)((int)uVar65 + 1);
        }
      }
    }
    fVar185 = ray->tfar;
    auVar135._4_4_ = fVar185;
    auVar135._0_4_ = fVar185;
    auVar135._8_4_ = fVar185;
    auVar135._12_4_ = fVar185;
    auVar135._16_4_ = fVar185;
    auVar135._20_4_ = fVar185;
    auVar135._24_4_ = fVar185;
    auVar135._28_4_ = fVar185;
    do {
      uVar72 = (uint)uVar65;
      uVar65 = (ulong)(uVar72 - 1);
      if (uVar72 == 0) {
        if (bVar67 != false) {
          return bVar67;
        }
        uVar15 = vcmpps_avx512vl(auVar135,local_240,0xd);
        uVar72 = (uint)local_4e8 & (uint)uVar15;
        local_4e8 = (ulong)uVar72;
        if (uVar72 == 0) {
          return false;
        }
        goto LAB_01d428d9;
      }
      auVar86 = *(undefined1 (*) [32])(auStack_160 + uVar65 * 0x18);
      auVar181._0_4_ = fVar142 + auVar86._0_4_;
      auVar181._4_4_ = fVar128 + auVar86._4_4_;
      auVar181._8_4_ = fVar153 + auVar86._8_4_;
      auVar181._12_4_ = fVar155 + auVar86._12_4_;
      auVar181._16_4_ = fVar141 + auVar86._16_4_;
      auVar181._20_4_ = fVar157 + auVar86._20_4_;
      auVar181._24_4_ = fVar159 + auVar86._24_4_;
      auVar181._28_4_ = fVar161 + auVar86._28_4_;
      uVar15 = vcmpps_avx512vl(auVar181,auVar135,2);
      uVar121 = (uint)uVar15 & (uint)abStack_180[uVar65 * 0x60];
    } while (uVar121 == 0);
    uVar66 = (&uStack_140)[uVar65 * 0xc];
    auVar130._8_8_ = 0;
    auVar130._0_8_ = uVar66;
    auVar182._8_4_ = 0x7f800000;
    auVar182._0_8_ = 0x7f8000007f800000;
    auVar182._12_4_ = 0x7f800000;
    auVar182._16_4_ = 0x7f800000;
    auVar182._20_4_ = 0x7f800000;
    auVar182._24_4_ = 0x7f800000;
    auVar182._28_4_ = 0x7f800000;
    auVar84 = vblendmps_avx512vl(auVar182,auVar86);
    bVar61 = (byte)uVar121;
    auVar117._0_4_ =
         (uint)(bVar61 & 1) * auVar84._0_4_ | (uint)!(bool)(bVar61 & 1) * (int)auVar86._0_4_;
    bVar69 = (bool)((byte)(uVar121 >> 1) & 1);
    auVar117._4_4_ = (uint)bVar69 * auVar84._4_4_ | (uint)!bVar69 * (int)auVar86._4_4_;
    bVar69 = (bool)((byte)(uVar121 >> 2) & 1);
    auVar117._8_4_ = (uint)bVar69 * auVar84._8_4_ | (uint)!bVar69 * (int)auVar86._8_4_;
    bVar69 = (bool)((byte)(uVar121 >> 3) & 1);
    auVar117._12_4_ = (uint)bVar69 * auVar84._12_4_ | (uint)!bVar69 * (int)auVar86._12_4_;
    bVar69 = (bool)((byte)(uVar121 >> 4) & 1);
    auVar117._16_4_ = (uint)bVar69 * auVar84._16_4_ | (uint)!bVar69 * (int)auVar86._16_4_;
    bVar69 = (bool)((byte)(uVar121 >> 5) & 1);
    auVar117._20_4_ = (uint)bVar69 * auVar84._20_4_ | (uint)!bVar69 * (int)auVar86._20_4_;
    bVar69 = (bool)((byte)(uVar121 >> 6) & 1);
    auVar117._24_4_ = (uint)bVar69 * auVar84._24_4_ | (uint)!bVar69 * (int)auVar86._24_4_;
    auVar117._28_4_ =
         (uVar121 >> 7) * auVar84._28_4_ | (uint)!SUB41(uVar121 >> 7,0) * (int)auVar86._28_4_;
    auVar86 = vshufps_avx(auVar117,auVar117,0xb1);
    auVar86 = vminps_avx(auVar117,auVar86);
    auVar84 = vshufpd_avx(auVar86,auVar86,5);
    auVar86 = vminps_avx(auVar86,auVar84);
    auVar84 = vpermpd_avx2(auVar86,0x4e);
    auVar86 = vminps_avx(auVar86,auVar84);
    uVar15 = vcmpps_avx512vl(auVar117,auVar86,0);
    bVar64 = (byte)uVar15 & bVar61;
    if (bVar64 != 0) {
      uVar121 = (uint)bVar64;
    }
    uVar122 = 0;
    for (; (uVar121 & 1) == 0; uVar121 = uVar121 >> 1 | 0x80000000) {
      uVar122 = uVar122 + 1;
    }
    local_978 = aiStack_138[uVar65 * 0x18];
    bVar61 = ~('\x01' << ((byte)uVar122 & 0x1f)) & bVar61;
    abStack_180[uVar65 * 0x60] = bVar61;
    if (bVar61 == 0) {
      uVar72 = uVar72 - 1;
    }
    uVar129 = (undefined4)uVar66;
    auVar149._4_4_ = uVar129;
    auVar149._0_4_ = uVar129;
    auVar149._8_4_ = uVar129;
    auVar149._12_4_ = uVar129;
    auVar149._16_4_ = uVar129;
    auVar149._20_4_ = uVar129;
    auVar149._24_4_ = uVar129;
    auVar149._28_4_ = uVar129;
    auVar75 = vmovshdup_avx(auVar130);
    auVar75 = vsubps_avx(auVar75,auVar130);
    auVar136._0_4_ = auVar75._0_4_;
    auVar136._4_4_ = auVar136._0_4_;
    auVar136._8_4_ = auVar136._0_4_;
    auVar136._12_4_ = auVar136._0_4_;
    auVar136._16_4_ = auVar136._0_4_;
    auVar136._20_4_ = auVar136._0_4_;
    auVar136._24_4_ = auVar136._0_4_;
    auVar136._28_4_ = auVar136._0_4_;
    auVar75 = vfmadd132ps_fma(auVar136,auVar149,_DAT_01faff20);
    _local_2c0 = ZEXT1632(auVar75);
    local_330._8_8_ = 0;
    local_330._0_8_ = *(ulong *)(local_2c0 + (ulong)uVar122 * 4);
    uVar65 = (ulong)uVar72;
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));
         
          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }